

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  pointer pLVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  DstXprType *pDVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ChKblockGeneric *pCVar30;
  ChElementShellANCF_3833 *pCVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  DenseStorage<double,__1,__1,__1,_1> *pDVar35;
  double *pdVar36;
  char *__function;
  Index outer;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  ChElementShellANCF_3833 *pCVar43;
  PointerType pdVar44;
  int i_1;
  double *pdVar45;
  scalar_constant_op<double> *psVar46;
  scalar_constant_op<double> *psVar47;
  double dVar48;
  long lVar49;
  ActualDstType actualDst;
  long lVar50;
  double *pdVar51;
  uint uVar52;
  undefined1 (*pauVar54) [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double in_XMM0_Qb;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  VectorNIP E_BlockDamping;
  VectorNIP E1_Block;
  VectorNIP E2_Block;
  VectorNIP E3_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  DstEvaluatorType dstEvaluator;
  ChMatrixNM<double,_6,_6> D;
  SrcEvaluatorType srcEvaluator;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict2 S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  DenseStorage<double,__1,__1,__1,_1> local_47e0;
  ChElementShellANCF_3833 *local_47c0;
  long local_47b8;
  ChElementShellANCF_3833 *local_47b0;
  long local_47a8;
  DenseStorage<double,__1,__1,__1,_1> local_47a0;
  PointerType local_4780;
  double local_4778;
  DenseStorage<double,__1,__1,__1,_1> local_4770;
  ulong local_4750;
  ChMatrixRef *local_4748;
  undefined1 local_4740 [16];
  DenseStorage<double,__1,__1,__1,_1> *local_4730;
  variable_if_dynamic<long,__1> avStack_4728 [2];
  double dStack_4718;
  double local_4710;
  double dStack_4708;
  double local_4700;
  double dStack_46f8;
  double local_46f0;
  double dStack_46e8;
  double local_46e0;
  double dStack_46d8;
  double local_46d0;
  double dStack_46c8;
  double local_46c0;
  double dStack_46b8;
  long local_46b0;
  long local_46a8;
  scalar_constant_op<double> *local_46a0;
  int local_4698;
  int local_4694;
  generic_dense_assignment_kernel<_68f64e37_> local_4690;
  double local_4670;
  double dStack_4668;
  double local_4660;
  double dStack_4658;
  double local_4650;
  double dStack_4648;
  double local_4640;
  double dStack_4638;
  double local_4630;
  double dStack_4628;
  double local_4620;
  double dStack_4618;
  double local_4610;
  double dStack_4608;
  undefined1 local_4600 [16];
  variable_if_dynamic<long,__1> local_45f0;
  double adStack_45e8 [4];
  double dStack_45c8;
  double local_45c0;
  double dStack_45b8;
  double local_45b0;
  double dStack_45a8;
  double local_45a0;
  double dStack_4598;
  double local_4590;
  double dStack_4588;
  double local_4580;
  double dStack_4578;
  double local_4570;
  double dStack_4568;
  double local_4560 [4];
  double local_4540;
  double dStack_4538;
  double local_4530;
  double dStack_4528;
  double local_4520;
  double dStack_4518;
  double local_4510;
  double dStack_4508;
  double local_4500;
  double dStack_44f8;
  double local_44f0;
  double dStack_44e8;
  PointerType local_44e0;
  double dStack_44d8;
  double local_44d0;
  double dStack_44c8;
  double local_44c0;
  double dStack_44b8;
  double local_44b0;
  double dStack_44a8;
  double local_44a0 [4];
  double local_4480;
  double dStack_4478;
  double local_4470;
  double dStack_4468;
  double local_4460;
  double dStack_4458;
  double local_4450;
  double dStack_4448;
  double local_4440;
  double dStack_4438;
  double local_4430;
  double dStack_4428;
  double local_4420;
  double dStack_4418;
  double local_4410 [4];
  double local_43f0;
  double dStack_43e8;
  double local_43e0;
  double dStack_43d8;
  double local_43d0;
  double dStack_43c8;
  double local_43c0;
  double dStack_43b8;
  double local_43b0;
  double dStack_43a8;
  double local_43a0;
  double dStack_4398;
  double local_4390;
  double dStack_4388;
  double local_4380 [4];
  double local_4360;
  double dStack_4358;
  double local_4350;
  double dStack_4348;
  double local_4340;
  double dStack_4338;
  double local_4330;
  double dStack_4328;
  double local_4320;
  double dStack_4318;
  double local_4310;
  double dStack_4308;
  Matrix<double,_54,_6,_0,_54,_6> local_4300;
  undefined1 local_38e0 [88];
  pointer local_3888;
  Matrix<double,_24,_6,_1,_24,_6> *local_3880;
  pointer local_3878 [2];
  ChLoadableUV local_3868;
  ChLoadableUVW local_3860;
  pointer local_3858;
  Matrix<double,_24,_6,_1,_24,_6> *local_3850;
  pointer local_3848 [2];
  ChLoadableUV local_3838;
  ChLoadableUVW local_3830;
  pointer local_3828;
  Matrix<double,_24,_6,_1,_24,_6> *local_3820;
  pointer local_3818 [2];
  ChLoadableUV local_3808;
  ChLoadableUVW local_3800;
  pointer local_37f8;
  Matrix<double,_24,_6,_1,_24,_6> *local_37f0;
  pointer local_37e8 [2];
  ChLoadableUV local_37d8;
  ChLoadableUVW local_37d0;
  pointer local_37c8;
  double local_37c0 [5];
  assign_op<double,_double> *local_3798;
  double local_3790 [4];
  DenseStorage<double,__1,__1,__1,_1> local_3770;
  double dStack_3758;
  double local_3750;
  double dStack_3748;
  double local_3740;
  double dStack_3738;
  double local_3730;
  double dStack_3728;
  double local_3720;
  double dStack_3718;
  double local_3710;
  double dStack_3708;
  double local_3700;
  double dStack_36f8;
  double local_36f0;
  double dStack_36e8;
  double local_36e0;
  double dStack_36d8;
  double local_36d0;
  double dStack_36c8;
  double local_36c0;
  double dStack_36b8;
  double local_36b0;
  double dStack_36a8;
  double local_36a0;
  double dStack_3698;
  double local_3690;
  double dStack_3688;
  double local_3680;
  double dStack_3678;
  double local_3670;
  double dStack_3668;
  double local_3660;
  double dStack_3658;
  double local_3650;
  double dStack_3648;
  double local_3640;
  double dStack_3638;
  double local_3630;
  double dStack_3628;
  double local_3620;
  double dStack_3618;
  double local_3610;
  double dStack_3608;
  double local_3600;
  double dStack_35f8;
  double local_35f0;
  double dStack_35e8;
  double local_35e0;
  double dStack_35d8;
  double local_35d0;
  double dStack_35c8;
  double local_35c0;
  double dStack_35b8;
  double local_35b0;
  double dStack_35a8;
  double local_35a0;
  double dStack_3598;
  double local_3590;
  double dStack_3588;
  double local_3580;
  double dStack_3578;
  double local_3570;
  double dStack_3568;
  double local_3560;
  double dStack_3558;
  double local_3550;
  double dStack_3548;
  double local_3540;
  double dStack_3538;
  double local_3530;
  double dStack_3528;
  double local_3520;
  double dStack_3518;
  double local_3510;
  double dStack_3508;
  double local_3500;
  double dStack_34f8;
  double local_34f0;
  double dStack_34e8;
  double *local_34e0;
  double dStack_34d8;
  double local_34d0;
  double *pdStack_34c8;
  double local_34c0;
  double dStack_34b8;
  double local_34b0;
  double dStack_34a8;
  double local_34a0;
  double dStack_3498;
  double local_3490;
  double dStack_3488;
  double local_3480;
  double dStack_3478;
  double local_3470;
  double dStack_3468;
  double local_3460;
  double dStack_3458;
  double local_3450;
  double dStack_3448;
  double local_3440;
  double dStack_3438;
  double local_3430;
  double dStack_3428;
  double local_3420;
  double dStack_3418;
  double local_3410;
  double dStack_3408;
  double local_3400;
  double dStack_33f8;
  double local_33f0;
  double dStack_33e8;
  double local_33e0;
  double dStack_33d8;
  double local_33d0;
  double dStack_33c8;
  double local_33c0;
  double dStack_33b8;
  double local_33b0;
  double dStack_33a8;
  double local_33a0;
  double dStack_3398;
  double local_3390;
  double dStack_3388;
  double local_3380;
  double dStack_3378;
  double local_3370;
  double dStack_3368;
  double local_3360;
  double dStack_3358;
  double local_3350;
  double dStack_3348;
  double local_3340;
  double dStack_3338;
  double local_3330;
  double dStack_3328;
  double local_3320;
  double dStack_3318;
  double local_3310;
  double dStack_3308;
  double local_3300;
  double dStack_32f8;
  double local_32f0;
  double dStack_32e8;
  double local_32e0;
  double dStack_32d8;
  double local_32d0;
  double dStack_32c8;
  double local_32c0;
  double dStack_32b8;
  double local_32b0;
  double dStack_32a8;
  double local_32a0;
  double dStack_3298;
  double local_3290;
  double dStack_3288;
  double local_3280;
  double dStack_3278;
  double local_3270;
  double dStack_3268;
  double local_3260;
  double dStack_3258;
  double local_3250;
  double dStack_3248;
  double local_3240;
  double dStack_3238;
  double local_3230;
  double dStack_3228;
  double local_3220;
  double dStack_3218;
  double local_3210;
  double dStack_3208;
  double local_3200;
  double dStack_31f8;
  double local_31f0;
  double dStack_31e8;
  double local_31e0;
  double dStack_31d8;
  double local_31d0;
  double dStack_31c8;
  double local_31c0;
  double dStack_31b8;
  double local_31b0;
  double dStack_31a8;
  double local_31a0;
  double dStack_3198;
  double local_3190;
  double dStack_3188;
  double local_3180;
  double dStack_3178;
  double local_3170;
  double dStack_3168;
  double local_3160;
  double dStack_3158;
  double local_3150;
  double dStack_3148;
  double local_3140;
  double dStack_3138;
  double local_3130;
  double dStack_3128;
  double local_3120;
  double dStack_3118;
  double local_3110;
  double dStack_3108;
  double local_3100;
  double dStack_30f8;
  undefined1 *local_30f0;
  undefined1 local_30e8 [8];
  double local_30e0;
  double dStack_30d8;
  undefined1 local_30d0 [16];
  undefined1 local_30c0 [16];
  undefined1 local_30b0 [16];
  undefined1 local_30a0 [16];
  undefined1 local_3090 [16];
  undefined1 local_3080 [16];
  undefined1 local_3070 [16];
  undefined1 local_3060 [16];
  undefined1 local_3050 [16];
  undefined1 local_3040 [16];
  undefined1 local_3030 [16];
  undefined1 local_3020 [16];
  undefined1 local_3010 [16];
  undefined1 local_3000 [16];
  undefined1 local_2ff0 [16];
  undefined1 local_2fe0 [16];
  undefined1 local_2fd0 [16];
  undefined1 local_2fc0 [16];
  undefined1 local_2fb0 [16];
  undefined1 local_2fa0 [16];
  undefined1 local_2f90 [16];
  undefined1 local_2f80 [16];
  undefined1 local_2f70 [16];
  undefined1 local_2f60 [16];
  undefined1 local_2f50 [16];
  undefined1 local_2f40 [16];
  double local_2f30;
  double dStack_2f28;
  double local_2f20 [4];
  double local_2f00;
  double dStack_2ef8;
  double local_2ef0;
  double dStack_2ee8;
  double local_2ee0;
  double dStack_2ed8;
  undefined1 local_2ed0 [16];
  undefined1 local_2ec0 [16];
  undefined1 local_2eb0 [16];
  double local_2ea0;
  double dStack_2e98;
  double local_2e90 [4];
  double local_2e70;
  double dStack_2e68;
  double local_2e60;
  double dStack_2e58;
  double local_2e50;
  double dStack_2e48;
  double local_2e40;
  double dStack_2e38;
  double local_2e30;
  double dStack_2e28;
  double local_2e20;
  double dStack_2e18;
  PointerType local_2e10;
  double dStack_2e08;
  double local_2e00 [4];
  double local_2de0;
  double dStack_2dd8;
  double local_2dd0;
  double dStack_2dc8;
  double local_2dc0;
  double dStack_2db8;
  double local_2db0;
  double dStack_2da8;
  double local_2da0;
  double dStack_2d98;
  double local_2d90;
  double dStack_2d88;
  undefined1 local_2d80 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_2d78;
  assign_op<double,_double> *local_2d70;
  variable_if_dynamic<long,__1> avStack_2d68 [2];
  double dStack_2d58;
  scalar_constant_op<double> local_2d50 [2];
  double *local_2d40;
  variable_if_dynamic<long,__1> local_2d30;
  scalar_constant_op<double> local_2d20;
  double *local_2d10;
  variable_if_dynamic<long,__1> local_2d00;
  scalar_constant_op<double> local_2cf0;
  double *local_2ce0;
  variable_if_dynamic<long,__1> local_2cd0;
  scalar_constant_op<double> local_2cc0;
  double *local_2cb0;
  variable_if_dynamic<long,__1> local_2ca0;
  scalar_constant_op<double> local_2c90;
  double *local_2c80;
  variable_if_dynamic<long,__1> local_2c70;
  scalar_constant_op<double> local_2c60;
  double *local_2c50;
  variable_if_dynamic<long,__1> local_2c40;
  double local_2be0 [1244];
  MatrixNx6 local_500;
  double dVar53;
  
  local_3790[0] = Rfactor;
  local_3260 = Kfactor;
  dStack_3258 = in_XMM0_Qb;
  CalcCombinedCoordMatrix(this,&local_500);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_2d78.m_matrix = (non_const_type)&local_3770;
  local_3770.m_data = (double *)0x0;
  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.m_data.array
  [0] = (double)(H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
  local_2d80 = (undefined1  [8])&local_4300;
  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.m_data.array
  [2] = (double)(H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value;
  local_2d70 = (assign_op<double,_double> *)local_38e0;
  avStack_2d68[0].m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_2d80);
  if (0 < this->m_numLayers) {
    local_3798 = (assign_op<double,_double> *)&this->m_SD;
    local_4694 = 0x24;
    local_4698 = 0x12;
    local_37c0[2] = -1.0;
    local_37c0[3] = -1.0;
    local_37c0[0] = 0.5;
    local_37c0[1] = 0.5;
    local_4750 = 0;
    local_46b0 = 0;
    local_3250 = local_3260;
    dStack_3248 = local_3260;
    local_47c0 = this;
    local_4748 = H;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x18) {
LAB_0076dcd8:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 24, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 24, BlockCols = 54, InnerPanel = false]"
        ;
LAB_0076dc6a:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      uVar52 = (int)local_46b0 * 0x36;
      dVar53 = (double)(ulong)uVar52;
      dVar48 = (double)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols;
      local_3790[2] = (double)((long)dVar53 + 0x36);
      if ((long)dVar48 < (long)local_3790[2]) goto LAB_0076dcd8;
      local_44e0 = (PointerType)((long)dVar53 * 8);
      local_2d80 = (undefined1  [8])(*(long *)local_3798 + (long)local_44e0);
      local_2d70 = local_3798;
      avStack_2d68[0].m_value = 0;
      avStack_2d68[1].m_value = (long)dVar53;
      dStack_2d58 = dVar48;
      local_2d50[0].m_other = (double)&local_500;
      memset(&local_4300,0,0xa20);
      local_3770.m_data = (double *)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,54,6,0,54,6>>
                (&local_4300,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>
                  *)local_2d80,&local_500,(Scalar *)&local_3770);
      local_47a0.m_cols = 0;
      local_47a0.m_data = (double *)0x0;
      local_47a0.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_47a0,0x1e60,0x48,0x6c);
      lVar42 = local_46b0;
      pCVar43 = local_47c0;
      if (local_46b0 == 0x25ed098) {
LAB_0076dc55:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 18>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 18, InnerPanel = false]"
        ;
        goto LAB_0076dc6a;
      }
      local_4750 = local_4750 & 0xffffffff;
      local_3790[1] = (double)(local_4750 * 8);
      local_46a0 = (scalar_constant_op<double> *)(long)local_4694;
      local_46a8 = (long)local_4698;
      local_4780 = (PointerType)(long)(int)uVar52;
      local_47b8 = (long)local_4780 + 0x12;
      iVar32 = uVar52 + 0x12;
      local_44c0 = (double)CONCAT44(local_44c0._4_4_,iVar32);
      local_47a8 = (long)iVar32;
      lVar37 = local_47a8 + 0x12;
      iVar33 = uVar52 + 0x24;
      local_44d0 = (double)CONCAT44(local_44d0._4_4_,iVar33);
      local_47b0 = (ChElementShellANCF_3833 *)(long)iVar33;
      puVar1 = (undefined1 *)
               ((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_data + 2);
      lVar49 = 0;
      lVar50 = 0;
      do {
        local_4778 = dVar53;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar34 < local_47b8)) || (local_47a0.m_rows <= lVar49)) ||
           (local_47a0.m_cols < 0x12)) goto LAB_0076dc55;
        pdVar36 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar39] =
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0];
        (local_47a0.m_data + lVar39)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[1];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 2] =
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[2];
        (local_47a0.m_data + lVar39 + 2)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[3];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 4] =
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[4];
        (local_47a0.m_data + lVar39 + 4)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[5];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 6] =
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[6];
        (local_47a0.m_data + lVar39 + 6)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[7];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 8] =
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[8];
        (local_47a0.m_data + lVar39 + 8)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[9];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 10] =
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[10];
        (local_47a0.m_data + lVar39 + 10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xb];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0xc] =
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xc];
        (local_47a0.m_data + lVar39 + 0xc)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xd];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0xe] =
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xe];
        (local_47a0.m_data + lVar39 + 0xe)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xf];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x10] =
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x10];
        (local_47a0.m_data + lVar39 + 0x10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x11];
        if (((iVar32 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar50)) ||
           ((lVar34 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar34 < lVar37 ||
            ((local_47a0.m_rows <= lVar49 || (local_47a0.m_cols < 0x24)))))) goto LAB_0076dc55;
        pdVar36 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar39 + 0x12] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x12];
        (local_47a0.m_data + lVar39 + 0x12)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x13];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x14] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x14];
        (local_47a0.m_data + lVar39 + 0x14)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x15];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x16] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x16];
        (local_47a0.m_data + lVar39 + 0x16)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x17];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x18] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x18];
        (local_47a0.m_data + lVar39 + 0x18)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x19];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x1a] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1a];
        (local_47a0.m_data + lVar39 + 0x1a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 0x1c] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1c];
        (local_47a0.m_data + lVar39 + 0x1c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x1e] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1e];
        (local_47a0.m_data + lVar39 + 0x1e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x20] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x20];
        (local_47a0.m_data + lVar39 + 0x20)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x21];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x22] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x22];
        (local_47a0.m_data + lVar39 + 0x22)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x23];
        if (((iVar33 < 0) ||
            ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50 ||
              (lVar34 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar34 < (long)puVar1)) || (local_47a0.m_rows <= lVar49)))) ||
           (local_47a0.m_cols < 0x36)) goto LAB_0076dc55;
        pdVar36 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x24];
        (local_47a0.m_data + lVar39 + 0x24)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x25];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x26];
        (local_47a0.m_data + lVar39 + 0x26)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x27];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x28];
        (local_47a0.m_data + lVar39 + 0x28)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x29];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2a];
        (local_47a0.m_data + lVar39 + 0x2a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x2b];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2c];
        (local_47a0.m_data + lVar39 + 0x2c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x2d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2e];
        (local_47a0.m_data + lVar39 + 0x2e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x2f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x30];
        (local_47a0.m_data + lVar39 + 0x30)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x31];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x32];
        (local_47a0.m_data + lVar39 + 0x32)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x33];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x34];
        (local_47a0.m_data + lVar39 + 0x34)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x35];
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            (lVar34 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar34 < (long)puVar1)) ||
           ((lVar34 < lVar37 || ((local_47a0.m_rows <= lVar49 || (local_47a0.m_cols < 0x48))))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar39 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x12] +
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x24];
        (local_47a0.m_data + lVar39 + 0x36)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x13] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x25];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x14] +
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x26];
        (local_47a0.m_data + lVar39 + 0x38)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x15] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x27];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x16] +
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x28];
        (local_47a0.m_data + lVar39 + 0x3a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x17] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x29];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x18] +
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2a];
        (local_47a0.m_data + lVar39 + 0x3c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x19] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2b];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1a] +
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2c];
        (local_47a0.m_data + lVar39 + 0x3e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1c] +
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2e];
        (local_47a0.m_data + lVar39 + 0x40)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1e] +
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x30];
        (local_47a0.m_data + lVar39 + 0x42)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x1f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x31];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x20] +
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x32];
        (local_47a0.m_data + lVar39 + 0x44)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x21] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x33];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x22] +
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x34];
        (local_47a0.m_data + lVar39 + 0x46)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x23] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x35];
        if (((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar50) ||
           ((((lVar34 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar34 < (long)puVar1 || (lVar34 < local_47b8)) ||
             (local_47a0.m_rows <= lVar49)) || (local_47a0.m_cols < 0x5a)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x24];
        (local_47a0.m_data + lVar39 + 0x48)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[1] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x25];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[2] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x26];
        (local_47a0.m_data + lVar39 + 0x4a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[3] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x27];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[4] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x28];
        (local_47a0.m_data + lVar39 + 0x4c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[5] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x29];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[6] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2a];
        (local_47a0.m_data + lVar39 + 0x4e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[7] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2b];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[8] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2c];
        (local_47a0.m_data + lVar39 + 0x50)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[9] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[10] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x2e];
        (local_47a0.m_data + lVar39 + 0x52)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xb] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x2f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xc] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x30];
        (local_47a0.m_data + lVar39 + 0x54)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xd] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x31];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xe] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x32];
        (local_47a0.m_data + lVar39 + 0x56)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xf] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x33];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x10] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x34];
        (local_47a0.m_data + lVar39 + 0x58)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x11] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x35];
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            (lVar34 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar34 < lVar37)) ||
           ((lVar34 < local_47b8 || ((local_47a0.m_rows <= lVar49 || (local_47a0.m_cols < 0x6c))))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar49;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x5a] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x12];
        (local_47a0.m_data + lVar39 + 0x5a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[1] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x13];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x5c] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[2] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x14];
        (local_47a0.m_data + lVar39 + 0x5c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[3] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x15];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x5e] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[4] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x16];
        (local_47a0.m_data + lVar39 + 0x5e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[5] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x17];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x60] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[6] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x18];
        (local_47a0.m_data + lVar39 + 0x60)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[7] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x19];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x62] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[8] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1a];
        (local_47a0.m_data + lVar39 + 0x62)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[9] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x1b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 100] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[10] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1c];
        (local_47a0.m_data + lVar39 + 100)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xb] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x1d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x66] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xc] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x1e];
        (local_47a0.m_data + lVar39 + 0x66)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xd] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x1f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x68] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xe] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x20];
        (local_47a0.m_data + lVar39 + 0x68)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xf] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x21];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x6a] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x10] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x22];
        (local_47a0.m_data + lVar39 + 0x6a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x11] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x23];
        if (((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar50) ||
           (((lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < local_47b8 ||
             (lVar39 = lVar49 + 1, local_47a0.m_rows <= lVar39)) || (local_47a0.m_cols < 0x12))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar40] =
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x36];
        (local_47a0.m_data + lVar40)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x37];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 2] =
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x38];
        (local_47a0.m_data + lVar40 + 2)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x39];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 4] =
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3a];
        (local_47a0.m_data + lVar40 + 4)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3b];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 6] =
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3c];
        (local_47a0.m_data + lVar40 + 6)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3d];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 8] =
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3e];
        (local_47a0.m_data + lVar40 + 8)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3f];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 10] =
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x40];
        (local_47a0.m_data + lVar40 + 10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x41];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0xc] =
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x42];
        (local_47a0.m_data + lVar40 + 0xc)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x43];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0xe] =
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x44];
        (local_47a0.m_data + lVar40 + 0xe)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x45];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x10] =
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x46];
        (local_47a0.m_data + lVar40 + 0x10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x47];
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            (lVar34 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar34 < lVar37)) ||
           ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x24)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar40 + 0x12] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x48];
        (local_47a0.m_data + lVar40 + 0x12)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x49];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x14] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4a];
        (local_47a0.m_data + lVar40 + 0x14)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x16] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4c];
        (local_47a0.m_data + lVar40 + 0x16)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x18] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4e];
        (local_47a0.m_data + lVar40 + 0x18)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x1a] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x50];
        (local_47a0.m_data + lVar40 + 0x1a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x51];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x1c] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x52];
        (local_47a0.m_data + lVar40 + 0x1c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x53];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x1e] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x54];
        (local_47a0.m_data + lVar40 + 0x1e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x55];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x20] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x56];
        (local_47a0.m_data + lVar40 + 0x20)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x57];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x22] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x58];
        (local_47a0.m_data + lVar40 + 0x22)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x59];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < (long)puVar1)) || (local_47a0.m_rows <= lVar39)) ||
           (local_47a0.m_cols < 0x36)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5a];
        (local_47a0.m_data + lVar40 + 0x24)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x5b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5c];
        (local_47a0.m_data + lVar40 + 0x26)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x5d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5e];
        (local_47a0.m_data + lVar40 + 0x28)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x5f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x60];
        (local_47a0.m_data + lVar40 + 0x2a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x61];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x62];
        (local_47a0.m_data + lVar40 + 0x2c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[100];
        (local_47a0.m_data + lVar40 + 0x2e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x65];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x66];
        (local_47a0.m_data + lVar40 + 0x30)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x67];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x68];
        (local_47a0.m_data + lVar40 + 0x32)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x69];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6a];
        (local_47a0.m_data + lVar40 + 0x34)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6b];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < (long)puVar1)) || (lVar34 < lVar37)) ||
           ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x48)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar40 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x48] +
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5a];
        (local_47a0.m_data + lVar40 + 0x36)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x49] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4a] +
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5c];
        (local_47a0.m_data + lVar40 + 0x38)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4c] +
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5e];
        (local_47a0.m_data + lVar40 + 0x3a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4e] +
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x60];
        (local_47a0.m_data + lVar40 + 0x3c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x4f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x61];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x50] +
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x62];
        (local_47a0.m_data + lVar40 + 0x3e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x51] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x52] +
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[100];
        (local_47a0.m_data + lVar40 + 0x40)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x53] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x65];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x54] +
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x66];
        (local_47a0.m_data + lVar40 + 0x42)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x55] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x67];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x56] +
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x68];
        (local_47a0.m_data + lVar40 + 0x44)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x57] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x69];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x58] +
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6a];
        (local_47a0.m_data + lVar40 + 0x46)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x59] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x6b];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             ((lVar34 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar34 < (long)puVar1 || (lVar34 < local_47b8)))) ||
            (local_47a0.m_rows <= lVar39)) || (local_47a0.m_cols < 0x5a)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x36] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5a];
        (local_47a0.m_data + lVar40 + 0x48)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x37] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x38] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5c];
        (local_47a0.m_data + lVar40 + 0x4a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x39] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3a] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x5e];
        (local_47a0.m_data + lVar40 + 0x4c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x5f];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3c] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x60];
        (local_47a0.m_data + lVar40 + 0x4e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x61];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3e] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x62];
        (local_47a0.m_data + lVar40 + 0x50)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x40] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[100];
        (local_47a0.m_data + lVar40 + 0x52)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x41] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x65];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x42] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x66];
        (local_47a0.m_data + lVar40 + 0x54)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x43] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x67];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x44] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x68];
        (local_47a0.m_data + lVar40 + 0x56)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x45] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x69];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x46] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6a];
        (local_47a0.m_data + lVar40 + 0x58)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x47] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x6b];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < lVar37)) || (lVar34 < local_47b8)) ||
           ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x6c)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x5a] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x36] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x48];
        (local_47a0.m_data + lVar39 + 0x5a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x37] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x49];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x5c] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x38] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4a];
        (local_47a0.m_data + lVar39 + 0x5c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x39] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x4b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x5e] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3a] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4c];
        (local_47a0.m_data + lVar39 + 0x5e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x4d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x60] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3c] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x4e];
        (local_47a0.m_data + lVar39 + 0x60)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x4f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x62] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x3e] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x50];
        (local_47a0.m_data + lVar39 + 0x62)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x3f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x51];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 100] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x40] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x52];
        (local_47a0.m_data + lVar39 + 100)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x41] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x53];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x66] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x42] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x54];
        (local_47a0.m_data + lVar39 + 0x66)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x43] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x55];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x68] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x44] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x56];
        (local_47a0.m_data + lVar39 + 0x68)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x45] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x57];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x6a] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x46] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x58];
        (local_47a0.m_data + lVar39 + 0x6a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x47] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x59];
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            ((lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < local_47b8 ||
             (lVar39 = lVar49 + 2, local_47a0.m_rows <= lVar39)))) || (local_47a0.m_cols < 0x12))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar40] =
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6c];
        (local_47a0.m_data + lVar40)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6d];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 2] =
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6e];
        (local_47a0.m_data + lVar40 + 2)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6f];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 4] =
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x70];
        (local_47a0.m_data + lVar40 + 4)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x71];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 6] =
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x72];
        (local_47a0.m_data + lVar40 + 6)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x73];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 8] =
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x74];
        (local_47a0.m_data + lVar40 + 8)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x75];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 10] =
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x76];
        (local_47a0.m_data + lVar40 + 10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x77];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0xc] =
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x78];
        (local_47a0.m_data + lVar40 + 0xc)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x79];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0xe] =
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7a];
        (local_47a0.m_data + lVar40 + 0xe)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7b];
        dVar48 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x10] =
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7c];
        (local_47a0.m_data + lVar40 + 0x10)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7d];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < lVar37)) || (local_47a0.m_rows <= lVar39)) ||
           (local_47a0.m_cols < 0x24)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar40 + 0x12] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7e];
        (local_47a0.m_data + lVar40 + 0x12)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x14] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x80];
        (local_47a0.m_data + lVar40 + 0x14)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x81];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x16] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x82];
        (local_47a0.m_data + lVar40 + 0x16)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x83];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x18] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x84];
        (local_47a0.m_data + lVar40 + 0x18)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x85];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x1a] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x86];
        (local_47a0.m_data + lVar40 + 0x1a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x87];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x1c] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x88];
        (local_47a0.m_data + lVar40 + 0x1c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x89];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x1e] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8a];
        (local_47a0.m_data + lVar40 + 0x1e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x20] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8c];
        (local_47a0.m_data + lVar40 + 0x20)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x22] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8e];
        (local_47a0.m_data + lVar40 + 0x22)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8f];
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            (lVar34 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar34 < (long)puVar1)) ||
           ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x36)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x90];
        (local_47a0.m_data + lVar40 + 0x24)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x91];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x92];
        (local_47a0.m_data + lVar40 + 0x26)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x93];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x94];
        (local_47a0.m_data + lVar40 + 0x28)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x95];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x96];
        (local_47a0.m_data + lVar40 + 0x2a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x97];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x98];
        (local_47a0.m_data + lVar40 + 0x2c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9a];
        (local_47a0.m_data + lVar40 + 0x2e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x9b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9c];
        (local_47a0.m_data + lVar40 + 0x30)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x9d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9e];
        (local_47a0.m_data + lVar40 + 0x32)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x9f];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xa0];
        (local_47a0.m_data + lVar40 + 0x34)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0xa1];
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar50) ||
             (lVar34 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar34 < (long)puVar1)) || (lVar34 < lVar37)) ||
           ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x48)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34)[1];
        local_47a0.m_data[lVar40 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7e] +
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x90];
        (local_47a0.m_data + lVar40 + 0x36)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x91];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x80] +
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x92];
        (local_47a0.m_data + lVar40 + 0x38)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x81] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x93];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x82] +
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x94];
        (local_47a0.m_data + lVar40 + 0x3a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x83] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x95];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x84] +
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x96];
        (local_47a0.m_data + lVar40 + 0x3c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x85] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x97];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x86] +
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x98];
        (local_47a0.m_data + lVar40 + 0x3e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x87] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x88] +
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9a];
        (local_47a0.m_data + lVar40 + 0x40)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x89] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8a] +
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9c];
        (local_47a0.m_data + lVar40 + 0x42)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8c] +
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9e];
        (local_47a0.m_data + lVar40 + 0x44)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9f];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8e] +
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xa0];
        (local_47a0.m_data + lVar40 + 0x46)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x8f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0xa1];
        if (((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar50) ||
           ((((lVar34 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar34 < (long)puVar1 || (lVar34 < local_47b8)) ||
             (local_47a0.m_rows <= lVar39)) || (local_47a0.m_cols < 0x5a)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar40 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar34))[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar40 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6c] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x90];
        (local_47a0.m_data + lVar40 + 0x48)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x91];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar40 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6e] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x92];
        (local_47a0.m_data + lVar40 + 0x4a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x93];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar40 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x70] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x94];
        (local_47a0.m_data + lVar40 + 0x4c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x71] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x95];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar40 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x72] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x96];
        (local_47a0.m_data + lVar40 + 0x4e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x73] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x97];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar40 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x74] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x98];
        (local_47a0.m_data + lVar40 + 0x50)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x75] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x99];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar40 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x76] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9a];
        (local_47a0.m_data + lVar40 + 0x52)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x77] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9b];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar40 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x78] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9c];
        (local_47a0.m_data + lVar40 + 0x54)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x79] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9d];
        dVar48 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar40 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7a] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x9e];
        (local_47a0.m_data + lVar40 + 0x56)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x9f];
        dVar48 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar34))[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar40 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7c] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0xa0];
        (local_47a0.m_data + lVar40 + 0x58)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0xa1];
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar50) ||
            (lVar34 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar34 < lVar37)) ||
           ((lVar34 < local_47b8 || ((local_47a0.m_rows <= lVar39 || (local_47a0.m_cols < 0x6c))))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar34 = lVar34 * lVar50;
        lVar39 = local_47a0.m_cols * lVar39;
        dVar48 = (pdVar36 + local_47a8 + lVar34)[1];
        dVar5 = (pdVar36 + (long)((long)local_4780 + lVar34))[1];
        local_47a0.m_data[lVar39 + 0x5a] =
             pdVar36[local_47a8 + lVar34] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6c] +
             pdVar36[(long)((long)local_4780 + lVar34)] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7e];
        (local_47a0.m_data + lVar39 + 0x5a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x7f];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 2)[1];
        local_47a0.m_data[lVar39 + 0x5c] =
             pdVar36[local_47a8 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x6e] +
             pdVar36[(long)local_4780 + lVar34 + 2] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x80];
        (local_47a0.m_data + lVar39 + 0x5c)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x6f] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x81];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 4)[1];
        local_47a0.m_data[lVar39 + 0x5e] =
             pdVar36[local_47a8 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x70] +
             pdVar36[(long)local_4780 + lVar34 + 4] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x82];
        (local_47a0.m_data + lVar39 + 0x5e)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x71] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x83];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 6)[1];
        local_47a0.m_data[lVar39 + 0x60] =
             pdVar36[local_47a8 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x72] +
             pdVar36[(long)local_4780 + lVar34 + 6] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x84];
        (local_47a0.m_data + lVar39 + 0x60)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x73] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x85];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 8)[1];
        local_47a0.m_data[lVar39 + 0x62] =
             pdVar36[local_47a8 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x74] +
             pdVar36[(long)local_4780 + lVar34 + 8] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x86];
        (local_47a0.m_data + lVar39 + 0x62)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x75] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x87];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 10)[1];
        local_47a0.m_data[lVar39 + 100] =
             pdVar36[local_47a8 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x76] +
             pdVar36[(long)local_4780 + lVar34 + 10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x88];
        (local_47a0.m_data + lVar39 + 100)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x77] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x89];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xc)[1];
        local_47a0.m_data[lVar39 + 0x66] =
             pdVar36[local_47a8 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x78] +
             pdVar36[(long)local_4780 + lVar34 + 0xc] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8a];
        (local_47a0.m_data + lVar39 + 0x66)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x79] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x8b];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0xe)[1];
        local_47a0.m_data[lVar39 + 0x68] =
             pdVar36[local_47a8 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7a] +
             pdVar36[(long)local_4780 + lVar34 + 0xe] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8c];
        (local_47a0.m_data + lVar39 + 0x68)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7b] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x8d];
        dVar48 = (pdVar36 + local_47a8 + lVar34 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4780 + lVar34 + 0x10)[1];
        local_47a0.m_data[lVar39 + 0x6a] =
             pdVar36[local_47a8 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x7c] +
             pdVar36[(long)local_4780 + lVar34 + 0x10] *
             local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
             m_data.array[0x8e];
        (local_47a0.m_data + lVar39 + 0x6a)[1] =
             dVar48 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                      m_storage.m_data.array[0x7d] +
             dVar5 * local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                     m_storage.m_data.array[0x8f];
        lVar50 = lVar50 + 1;
        lVar49 = lVar49 + 3;
        this = local_47c0;
      } while (lVar50 != 0x18);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_47c0->m_Alpha;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_3790[0];
      auVar55._8_8_ = dStack_3258;
      auVar55._0_8_ = local_3260;
      auVar55 = vfmadd213sd_fma(auVar60,auVar56,auVar55);
      dVar48 = local_47c0->m_Alpha * local_3260;
      pDVar35 = &local_3770;
      pdVar36 = (double *)&local_4300;
      lVar37 = 0;
      do {
        uVar41 = 0xfffffffffffffffe;
        do {
          dVar5 = (pdVar36 + uVar41 + 2)[1];
          dVar57 = (pdVar36 + uVar41 + 0xa4)[1];
          (&pDVar35->m_cols)[uVar41] =
               (Index)(auVar55._0_8_ * pdVar36[uVar41 + 2] + dVar48 * pdVar36[uVar41 + 0xa4]);
          (&pDVar35->m_cols + uVar41)[1] = (Index)(auVar55._0_8_ * dVar5 + dVar48 * dVar57);
          uVar41 = uVar41 + 2;
        } while (uVar41 < 0x34);
        lVar37 = lVar37 + 1;
        pdVar36 = pdVar36 + 0x36;
        pDVar35 = pDVar35 + 0x12;
      } while (lVar37 != 3);
      local_4780 = (PointerType)(local_46b0 * 0x12 + 0x12);
      if (((local_47c0->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((local_47c0->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (local_47c0->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_storage.m_data;
      lVar37 = 0x1a0;
      do {
        dVar48 = (pdVar36 + local_46b0 * 0x12)[1];
        *(double *)(local_38e0 + lVar37 + -0x30) =
             pdVar36[local_46b0 * 0x12] * *(double *)(local_38e0 + lVar37 + -0x30);
        *(double *)(local_38e0 + lVar37 + -0x28) = dVar48 * *(double *)(local_38e0 + lVar37 + -0x28)
        ;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 2)[1];
        *(double *)(local_38e0 + lVar37 + -0x20) =
             pdVar36[local_46b0 * 0x12 + 2] * *(double *)(local_38e0 + lVar37 + -0x20);
        *(double *)(local_38e0 + lVar37 + -0x18) = dVar48 * *(double *)(local_38e0 + lVar37 + -0x18)
        ;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 4)[1];
        *(double *)(local_38e0 + lVar37 + -0x10) =
             pdVar36[local_46b0 * 0x12 + 4] * *(double *)(local_38e0 + lVar37 + -0x10);
        *(double *)(local_38e0 + lVar37 + -8) = dVar48 * *(double *)(local_38e0 + lVar37 + -8);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 6)[1];
        *(double *)(local_38e0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 6] * *(double *)(local_38e0 + lVar37);
        *(double *)(local_38e0 + lVar37 + 8) = dVar48 * *(double *)(local_38e0 + lVar37 + 8);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 8)[1];
        *(double *)(local_38e0 + lVar37 + 0x10) =
             pdVar36[local_46b0 * 0x12 + 8] * *(double *)(local_38e0 + lVar37 + 0x10);
        *(double *)(local_38e0 + lVar37 + 0x18) = dVar48 * *(double *)(local_38e0 + lVar37 + 0x18);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 10)[1];
        *(double *)(local_38e0 + lVar37 + 0x20) =
             pdVar36[local_46b0 * 0x12 + 10] * *(double *)(local_38e0 + lVar37 + 0x20);
        *(double *)(local_38e0 + lVar37 + 0x28) = dVar48 * *(double *)(local_38e0 + lVar37 + 0x28);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xc)[1];
        *(double *)(local_38e0 + lVar37 + 0x30) =
             pdVar36[local_46b0 * 0x12 + 0xc] * *(double *)(local_38e0 + lVar37 + 0x30);
        *(double *)(local_38e0 + lVar37 + 0x38) = dVar48 * *(double *)(local_38e0 + lVar37 + 0x38);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xe)[1];
        *(double *)(local_38e0 + lVar37 + 0x40) =
             pdVar36[local_46b0 * 0x12 + 0xe] * *(double *)(local_38e0 + lVar37 + 0x40);
        *(double *)(local_38e0 + lVar37 + 0x48) = dVar48 * *(double *)(local_38e0 + lVar37 + 0x48);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0x10)[1];
        dVar5 = *(double *)((long)&local_3888 + lVar37);
        *(double *)(local_38e0 + lVar37 + 0x50) =
             pdVar36[local_46b0 * 0x12 + 0x10] * *(double *)(local_38e0 + lVar37 + 0x50);
        *(double *)((long)&local_3888 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12)[1];
        *(double *)((long)&local_3880 + lVar37) =
             pdVar36[local_46b0 * 0x12] * *(double *)((long)&local_3880 + lVar37);
        *(double *)((long)local_3878 + lVar37) = dVar48 * *(double *)((long)local_3878 + lVar37);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 2)[1];
        dVar5 = *(double *)(&local_3868.field_0x0 + lVar37);
        *(double *)((long)local_3878 + lVar37 + 8) =
             pdVar36[local_46b0 * 0x12 + 2] * *(double *)((long)local_3878 + lVar37 + 8);
        *(double *)(&local_3868.field_0x0 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 4)[1];
        dVar5 = *(double *)((long)&local_3858 + lVar37);
        *(double *)(&local_3860.field_0x0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 4] * *(double *)(&local_3860.field_0x0 + lVar37);
        *(double *)((long)&local_3858 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 6)[1];
        *(double *)((long)&local_3850 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 6] * *(double *)((long)&local_3850 + lVar37);
        *(double *)((long)local_3848 + lVar37) = dVar48 * *(double *)((long)local_3848 + lVar37);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 8)[1];
        dVar5 = *(double *)(&local_3838.field_0x0 + lVar37);
        *(double *)((long)local_3848 + lVar37 + 8) =
             pdVar36[local_46b0 * 0x12 + 8] * *(double *)((long)local_3848 + lVar37 + 8);
        *(double *)(&local_3838.field_0x0 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 10)[1];
        dVar5 = *(double *)((long)&local_3828 + lVar37);
        *(double *)(&local_3830.field_0x0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 10] * *(double *)(&local_3830.field_0x0 + lVar37);
        *(double *)((long)&local_3828 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xc)[1];
        *(double *)((long)&local_3820 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 0xc] * *(double *)((long)&local_3820 + lVar37);
        *(double *)((long)local_3818 + lVar37) = dVar48 * *(double *)((long)local_3818 + lVar37);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xe)[1];
        dVar5 = *(double *)(&local_3808.field_0x0 + lVar37);
        *(double *)((long)local_3818 + lVar37 + 8) =
             pdVar36[local_46b0 * 0x12 + 0xe] * *(double *)((long)local_3818 + lVar37 + 8);
        *(double *)(&local_3808.field_0x0 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0x10)[1];
        dVar5 = *(double *)((long)&local_37f8 + lVar37);
        *(double *)(&local_3800.field_0x0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 0x10] * *(double *)(&local_3800.field_0x0 + lVar37);
        *(double *)((long)&local_37f8 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12)[1];
        *(double *)((long)&local_37f0 + lVar37) =
             pdVar36[local_46b0 * 0x12] * *(double *)((long)&local_37f0 + lVar37);
        *(double *)((long)local_37e8 + lVar37) = dVar48 * *(double *)((long)local_37e8 + lVar37);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 2)[1];
        dVar5 = *(double *)(&local_37d8.field_0x0 + lVar37);
        *(double *)((long)local_37e8 + lVar37 + 8) =
             pdVar36[local_46b0 * 0x12 + 2] * *(double *)((long)local_37e8 + lVar37 + 8);
        *(double *)(&local_37d8.field_0x0 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 4)[1];
        dVar5 = *(double *)((long)&local_37c8 + lVar37);
        *(double *)(&local_37d0.field_0x0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 4] * *(double *)(&local_37d0.field_0x0 + lVar37);
        *(double *)((long)&local_37c8 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 6)[1];
        *(double *)((long)local_37c0 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 6] * *(double *)((long)local_37c0 + lVar37);
        *(double *)((long)local_37c0 + lVar37 + 8) =
             dVar48 * *(double *)((long)local_37c0 + lVar37 + 8);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 8)[1];
        *(double *)((long)local_37c0 + lVar37 + 0x10) =
             pdVar36[local_46b0 * 0x12 + 8] * *(double *)((long)local_37c0 + lVar37 + 0x10);
        *(double *)((long)local_37c0 + lVar37 + 0x18) =
             dVar48 * *(double *)((long)local_37c0 + lVar37 + 0x18);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 10)[1];
        dVar5 = *(double *)((long)&local_3798 + lVar37);
        *(double *)((long)local_37c0 + lVar37 + 0x20) =
             pdVar36[local_46b0 * 0x12 + 10] * *(double *)((long)local_37c0 + lVar37 + 0x20);
        *(double *)((long)&local_3798 + lVar37) = dVar48 * dVar5;
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xc)[1];
        *(double *)((long)local_3790 + lVar37) =
             pdVar36[local_46b0 * 0x12 + 0xc] * *(double *)((long)local_3790 + lVar37);
        *(double *)((long)local_3790 + lVar37 + 8) =
             dVar48 * *(double *)((long)local_3790 + lVar37 + 8);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0xe)[1];
        *(double *)((long)local_3790 + lVar37 + 0x10) =
             pdVar36[local_46b0 * 0x12 + 0xe] * *(double *)((long)local_3790 + lVar37 + 0x10);
        *(double *)((long)local_3790 + lVar37 + 0x18) =
             dVar48 * *(double *)((long)local_3790 + lVar37 + 0x18);
        dVar48 = (pdVar36 + local_46b0 * 0x12 + 0x10)[1];
        *(double *)((long)&local_3770.m_data + lVar37) =
             pdVar36[local_46b0 * 0x12 + 0x10] * *(double *)((long)&local_3770.m_data + lVar37);
        *(double *)((long)&local_3770.m_rows + lVar37) =
             dVar48 * *(double *)((long)&local_3770.m_rows + lVar37);
        lVar37 = lVar37 + 0x1b0;
      } while (lVar37 != 0x6b0);
      local_47e0.m_data = (double *)0x0;
      local_47e0.m_rows = 0;
      local_47e0.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_47e0,0x1e60,0x48,0x6c);
      lVar37 = local_46b0;
      dVar48 = local_4778;
      pCVar31 = local_47c0;
      local_47b8 = (long)dVar53 + 0x12;
      local_47a8 = (long)(int)(uVar52 + 0x12);
      lVar49 = local_47a8 + 0x12;
      local_47b0 = (ChElementShellANCF_3833 *)(long)(int)(uVar52 + 0x24);
      puVar1 = (undefined1 *)
               ((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_data + 2);
      lVar50 = 0;
      lVar34 = 0;
      do {
        if (((((pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (pCVar43->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < local_47b8)) || (local_47e0.m_rows <= lVar50)) ||
           (local_47e0.m_cols < 0x12)) goto LAB_0076dc55;
        pdVar36 = (pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39)))[1];
        local_47e0.m_data[lVar40] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39)) * (double)local_3770.m_data;
        (local_47e0.m_data + lVar40)[1] = dVar53 * (double)local_3770.m_rows;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)))[1];
        local_47e0.m_data[lVar40 + 2] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)) *
             (double)local_3770.m_cols;
        (local_47e0.m_data + lVar40 + 2)[1] = dVar53 * dStack_3758;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)))[1];
        local_47e0.m_data[lVar40 + 4] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)) * local_3750;
        (local_47e0.m_data + lVar40 + 4)[1] = dVar53 * dStack_3748;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)))[1];
        local_47e0.m_data[lVar40 + 6] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)) * local_3740;
        (local_47e0.m_data + lVar40 + 6)[1] = dVar53 * dStack_3738;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)))[1];
        local_47e0.m_data[lVar40 + 8] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)) * local_3730;
        (local_47e0.m_data + lVar40 + 8)[1] = dVar53 * dStack_3728;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)))[1];
        local_47e0.m_data[lVar40 + 10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)) * local_3720;
        (local_47e0.m_data + lVar40 + 10)[1] = dVar53 * dStack_3718;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)))[1];
        local_47e0.m_data[lVar40 + 0xc] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)) * local_3710;
        (local_47e0.m_data + lVar40 + 0xc)[1] = dVar53 * dStack_3708;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)))[1];
        local_47e0.m_data[lVar40 + 0xe] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)) * local_3700;
        (local_47e0.m_data + lVar40 + 0xe)[1] = dVar53 * dStack_36f8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)))[1];
        local_47e0.m_data[lVar40 + 0x10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)) * local_36f0;
        (local_47e0.m_data + lVar40 + 0x10)[1] = dVar53 * dStack_36e8;
        if ((((pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (pCVar43->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < lVar49)) ||
           ((local_47e0.m_rows <= lVar50 || (local_47e0.m_cols < 0x24)))) goto LAB_0076dc55;
        pdVar36 = (pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x12] = pdVar36[local_47a8 + lVar39] * local_36e0;
        (local_47e0.m_data + lVar40 + 0x12)[1] = dVar53 * dStack_36d8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x14] = pdVar36[local_47a8 + lVar39 + 2] * local_36d0;
        (local_47e0.m_data + lVar40 + 0x14)[1] = dVar53 * dStack_36c8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x16] = pdVar36[local_47a8 + lVar39 + 4] * local_36c0;
        (local_47e0.m_data + lVar40 + 0x16)[1] = dVar53 * dStack_36b8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x18] = pdVar36[local_47a8 + lVar39 + 6] * local_36b0;
        (local_47e0.m_data + lVar40 + 0x18)[1] = dVar53 * dStack_36a8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x1a] = pdVar36[local_47a8 + lVar39 + 8] * local_36a0;
        (local_47e0.m_data + lVar40 + 0x1a)[1] = dVar53 * dStack_3698;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 0x1c] = pdVar36[local_47a8 + lVar39 + 10] * local_3690;
        (local_47e0.m_data + lVar40 + 0x1c)[1] = dVar53 * dStack_3688;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x1e] = pdVar36[local_47a8 + lVar39 + 0xc] * local_3680;
        (local_47e0.m_data + lVar40 + 0x1e)[1] = dVar53 * dStack_3678;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x20] = pdVar36[local_47a8 + lVar39 + 0xe] * local_3670;
        (local_47e0.m_data + lVar40 + 0x20)[1] = dVar53 * dStack_3668;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x22] = pdVar36[local_47a8 + lVar39 + 0x10] * local_3660;
        (local_47e0.m_data + lVar40 + 0x22)[1] = dVar53 * dStack_3658;
        if ((((pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (pCVar43->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < (long)puVar1)) ||
           ((local_47e0.m_rows <= lVar50 || (local_47e0.m_cols < 0x36)))) goto LAB_0076dc55;
        pdVar36 = (pCVar43->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        local_47e0.m_data[lVar40 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_3650;
        (local_47e0.m_data + lVar40 + 0x24)[1] = dVar53 * dStack_3648;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_3640;
        (local_47e0.m_data + lVar40 + 0x26)[1] = dVar53 * dStack_3638;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_3630;
        (local_47e0.m_data + lVar40 + 0x28)[1] = dVar53 * dStack_3628;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3620;
        (local_47e0.m_data + lVar40 + 0x2a)[1] = dVar53 * dStack_3618;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        local_47e0.m_data[lVar40 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_3610;
        (local_47e0.m_data + lVar40 + 0x2c)[1] = dVar53 * dStack_3608;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3600;
        (local_47e0.m_data + lVar40 + 0x2e)[1] = dVar53 * dStack_35f8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_35f0;
        (local_47e0.m_data + lVar40 + 0x30)[1] = dVar53 * dStack_35e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_35e0;
        (local_47e0.m_data + lVar40 + 0x32)[1] = dVar53 * dStack_35d8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        local_47e0.m_data[lVar40 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_35d0;
        (local_47e0.m_data + lVar40 + 0x34)[1] = dVar53 * dStack_35c8;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < (long)puVar1)) || (lVar39 < lVar49)) ||
           ((local_47e0.m_rows <= lVar50 || (local_47e0.m_cols < 0x48)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_36e0 +
             pdVar36[local_47a8 + lVar39] * local_3650;
        (local_47e0.m_data + lVar40 + 0x36)[1] = dVar53 * dStack_36d8 + dVar5 * dStack_3648;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_36d0 +
             pdVar36[local_47a8 + lVar39 + 2] * local_3640;
        (local_47e0.m_data + lVar40 + 0x38)[1] = dVar53 * dStack_36c8 + dVar5 * dStack_3638;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_36c0 +
             pdVar36[local_47a8 + lVar39 + 4] * local_3630;
        (local_47e0.m_data + lVar40 + 0x3a)[1] = dVar53 * dStack_36b8 + dVar5 * dStack_3628;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_36b0 +
             pdVar36[local_47a8 + lVar39 + 6] * local_3620;
        (local_47e0.m_data + lVar40 + 0x3c)[1] = dVar53 * dStack_36a8 + dVar5 * dStack_3618;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_36a0 +
             pdVar36[local_47a8 + lVar39 + 8] * local_3610;
        (local_47e0.m_data + lVar40 + 0x3e)[1] = dVar53 * dStack_3698 + dVar5 * dStack_3608;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3690 +
             pdVar36[local_47a8 + lVar39 + 10] * local_3600;
        (local_47e0.m_data + lVar40 + 0x40)[1] = dVar53 * dStack_3688 + dVar5 * dStack_35f8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3680 +
             pdVar36[local_47a8 + lVar39 + 0xc] * local_35f0;
        (local_47e0.m_data + lVar40 + 0x42)[1] = dVar53 * dStack_3678 + dVar5 * dStack_35e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3670 +
             pdVar36[local_47a8 + lVar39 + 0xe] * local_35e0;
        (local_47e0.m_data + lVar40 + 0x44)[1] = dVar53 * dStack_3668 + dVar5 * dStack_35d8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3660 +
             pdVar36[local_47a8 + lVar39 + 0x10] * local_35d0;
        (local_47e0.m_data + lVar40 + 0x46)[1] = dVar53 * dStack_3658 + dVar5 * dStack_35c8;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             ((lVar39 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar39 < (long)puVar1 || (lVar39 < local_47b8)))) ||
            (local_47e0.m_rows <= lVar50)) || (local_47e0.m_cols < 0x5a)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] *
             (double)local_3770.m_data + pdVar36[(long)local_4778 + lVar39] * local_3650;
        (local_47e0.m_data + lVar40 + 0x48)[1] =
             dVar53 * (double)local_3770.m_rows + dVar5 * dStack_3648;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] *
             (double)local_3770.m_cols + pdVar36[(long)local_4778 + lVar39 + 2] * local_3640;
        (local_47e0.m_data + lVar40 + 0x4a)[1] = dVar53 * dStack_3758 + dVar5 * dStack_3638;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_3750 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_3630;
        (local_47e0.m_data + lVar40 + 0x4c)[1] = dVar53 * dStack_3748 + dVar5 * dStack_3628;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3740 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_3620;
        (local_47e0.m_data + lVar40 + 0x4e)[1] = dVar53 * dStack_3738 + dVar5 * dStack_3618;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_3730 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_3610;
        (local_47e0.m_data + lVar40 + 0x50)[1] = dVar53 * dStack_3728 + dVar5 * dStack_3608;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3720 +
             pdVar36[(long)local_4778 + lVar39 + 10] * local_3600;
        (local_47e0.m_data + lVar40 + 0x52)[1] = dVar53 * dStack_3718 + dVar5 * dStack_35f8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3710 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_35f0;
        (local_47e0.m_data + lVar40 + 0x54)[1] = dVar53 * dStack_3708 + dVar5 * dStack_35e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3700 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_35e0;
        (local_47e0.m_data + lVar40 + 0x56)[1] = dVar53 * dStack_36f8 + dVar5 * dStack_35d8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_36f0 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_35d0;
        (local_47e0.m_data + lVar40 + 0x58)[1] = dVar53 * dStack_36e8 + dVar5 * dStack_35c8;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < lVar49)) || (lVar39 < local_47b8)) ||
           ((local_47e0.m_rows <= lVar50 || (local_47e0.m_cols < 0x6c)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar50;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x5a] =
             pdVar36[local_47a8 + lVar39] * (double)local_3770.m_data +
             pdVar36[(long)local_4778 + lVar39] * local_36e0;
        (local_47e0.m_data + lVar40 + 0x5a)[1] =
             dVar53 * (double)local_3770.m_rows + dVar5 * dStack_36d8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x5c] =
             pdVar36[local_47a8 + lVar39 + 2] * (double)local_3770.m_cols +
             pdVar36[(long)local_4778 + lVar39 + 2] * local_36d0;
        (local_47e0.m_data + lVar40 + 0x5c)[1] = dVar53 * dStack_3758 + dVar5 * dStack_36c8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x5e] =
             pdVar36[local_47a8 + lVar39 + 4] * local_3750 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_36c0;
        (local_47e0.m_data + lVar40 + 0x5e)[1] = dVar53 * dStack_3748 + dVar5 * dStack_36b8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x60] =
             pdVar36[local_47a8 + lVar39 + 6] * local_3740 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_36b0;
        (local_47e0.m_data + lVar40 + 0x60)[1] = dVar53 * dStack_3738 + dVar5 * dStack_36a8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x62] =
             pdVar36[local_47a8 + lVar39 + 8] * local_3730 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_36a0;
        (local_47e0.m_data + lVar40 + 0x62)[1] = dVar53 * dStack_3728 + dVar5 * dStack_3698;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 100] =
             pdVar36[local_47a8 + lVar39 + 10] * local_3720 +
             pdVar36[(long)local_4778 + lVar39 + 10] * local_3690;
        (local_47e0.m_data + lVar40 + 100)[1] = dVar53 * dStack_3718 + dVar5 * dStack_3688;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x66] =
             pdVar36[local_47a8 + lVar39 + 0xc] * local_3710 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_3680;
        (local_47e0.m_data + lVar40 + 0x66)[1] = dVar53 * dStack_3708 + dVar5 * dStack_3678;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x68] =
             pdVar36[local_47a8 + lVar39 + 0xe] * local_3700 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_3670;
        (local_47e0.m_data + lVar40 + 0x68)[1] = dVar53 * dStack_36f8 + dVar5 * dStack_3668;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x6a] =
             pdVar36[local_47a8 + lVar39 + 0x10] * local_36f0 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_3660;
        (local_47e0.m_data + lVar40 + 0x6a)[1] = dVar53 * dStack_36e8 + dVar5 * dStack_3658;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            ((lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < local_47b8 ||
             (lVar40 = lVar50 + 1, local_47e0.m_rows <= lVar40)))) || (local_47e0.m_cols < 0x12))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39)))[1];
        local_47e0.m_data[lVar38] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39)) * local_35c0;
        (local_47e0.m_data + lVar38)[1] = dVar53 * dStack_35b8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)))[1];
        local_47e0.m_data[lVar38 + 2] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)) * local_35b0;
        (local_47e0.m_data + lVar38 + 2)[1] = dVar53 * dStack_35a8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)))[1];
        local_47e0.m_data[lVar38 + 4] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)) * local_35a0;
        (local_47e0.m_data + lVar38 + 4)[1] = dVar53 * dStack_3598;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)))[1];
        local_47e0.m_data[lVar38 + 6] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)) * local_3590;
        (local_47e0.m_data + lVar38 + 6)[1] = dVar53 * dStack_3588;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)))[1];
        local_47e0.m_data[lVar38 + 8] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)) * local_3580;
        (local_47e0.m_data + lVar38 + 8)[1] = dVar53 * dStack_3578;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)))[1];
        local_47e0.m_data[lVar38 + 10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)) * local_3570;
        (local_47e0.m_data + lVar38 + 10)[1] = dVar53 * dStack_3568;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)))[1];
        local_47e0.m_data[lVar38 + 0xc] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)) * local_3560;
        (local_47e0.m_data + lVar38 + 0xc)[1] = dVar53 * dStack_3558;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)))[1];
        local_47e0.m_data[lVar38 + 0xe] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)) * local_3550;
        (local_47e0.m_data + lVar38 + 0xe)[1] = dVar53 * dStack_3548;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)))[1];
        local_47e0.m_data[lVar38 + 0x10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)) * local_3540;
        (local_47e0.m_data + lVar38 + 0x10)[1] = dVar53 * dStack_3538;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < lVar49)) || (local_47e0.m_rows <= lVar40)) ||
           (local_47e0.m_cols < 0x24)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x12] = pdVar36[local_47a8 + lVar39] * local_3530;
        (local_47e0.m_data + lVar38 + 0x12)[1] = dVar53 * dStack_3528;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x14] = pdVar36[local_47a8 + lVar39 + 2] * local_3520;
        (local_47e0.m_data + lVar38 + 0x14)[1] = dVar53 * dStack_3518;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x16] = pdVar36[local_47a8 + lVar39 + 4] * local_3510;
        (local_47e0.m_data + lVar38 + 0x16)[1] = dVar53 * dStack_3508;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x18] = pdVar36[local_47a8 + lVar39 + 6] * local_3500;
        (local_47e0.m_data + lVar38 + 0x18)[1] = dVar53 * dStack_34f8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x1a] = pdVar36[local_47a8 + lVar39 + 8] * local_34f0;
        (local_47e0.m_data + lVar38 + 0x1a)[1] = dVar53 * dStack_34e8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x1c] = pdVar36[local_47a8 + lVar39 + 10] * (double)local_34e0;
        (local_47e0.m_data + lVar38 + 0x1c)[1] = dVar53 * dStack_34d8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x1e] = pdVar36[local_47a8 + lVar39 + 0xc] * local_34d0;
        (local_47e0.m_data + lVar38 + 0x1e)[1] = dVar53 * (double)pdStack_34c8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x20] = pdVar36[local_47a8 + lVar39 + 0xe] * local_34c0;
        (local_47e0.m_data + lVar38 + 0x20)[1] = dVar53 * dStack_34b8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x22] = pdVar36[local_47a8 + lVar39 + 0x10] * local_34b0;
        (local_47e0.m_data + lVar38 + 0x22)[1] = dVar53 * dStack_34a8;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < (long)puVar1)) ||
           ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x36)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_34a0;
        (local_47e0.m_data + lVar38 + 0x24)[1] = dVar53 * dStack_3498;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_3490;
        (local_47e0.m_data + lVar38 + 0x26)[1] = dVar53 * dStack_3488;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_3480;
        (local_47e0.m_data + lVar38 + 0x28)[1] = dVar53 * dStack_3478;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3470;
        (local_47e0.m_data + lVar38 + 0x2a)[1] = dVar53 * dStack_3468;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_3460;
        (local_47e0.m_data + lVar38 + 0x2c)[1] = dVar53 * dStack_3458;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3450;
        (local_47e0.m_data + lVar38 + 0x2e)[1] = dVar53 * dStack_3448;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3440;
        (local_47e0.m_data + lVar38 + 0x30)[1] = dVar53 * dStack_3438;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3430;
        (local_47e0.m_data + lVar38 + 0x32)[1] = dVar53 * dStack_3428;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3420;
        (local_47e0.m_data + lVar38 + 0x34)[1] = dVar53 * dStack_3418;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < (long)puVar1)) ||
           ((lVar39 < lVar49 || ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x48))))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_3530 +
             pdVar36[local_47a8 + lVar39] * local_34a0;
        (local_47e0.m_data + lVar38 + 0x36)[1] = dVar53 * dStack_3528 + dVar5 * dStack_3498;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_3520 +
             pdVar36[local_47a8 + lVar39 + 2] * local_3490;
        (local_47e0.m_data + lVar38 + 0x38)[1] = dVar53 * dStack_3518 + dVar5 * dStack_3488;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_3510 +
             pdVar36[local_47a8 + lVar39 + 4] * local_3480;
        (local_47e0.m_data + lVar38 + 0x3a)[1] = dVar53 * dStack_3508 + dVar5 * dStack_3478;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3500 +
             pdVar36[local_47a8 + lVar39 + 6] * local_3470;
        (local_47e0.m_data + lVar38 + 0x3c)[1] = dVar53 * dStack_34f8 + dVar5 * dStack_3468;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_34f0 +
             pdVar36[local_47a8 + lVar39 + 8] * local_3460;
        (local_47e0.m_data + lVar38 + 0x3e)[1] = dVar53 * dStack_34e8 + dVar5 * dStack_3458;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * (double)local_34e0 +
             pdVar36[local_47a8 + lVar39 + 10] * local_3450;
        (local_47e0.m_data + lVar38 + 0x40)[1] = dVar53 * dStack_34d8 + dVar5 * dStack_3448;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_34d0 +
             pdVar36[local_47a8 + lVar39 + 0xc] * local_3440;
        (local_47e0.m_data + lVar38 + 0x42)[1] = dVar53 * (double)pdStack_34c8 + dVar5 * dStack_3438
        ;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_34c0 +
             pdVar36[local_47a8 + lVar39 + 0xe] * local_3430;
        (local_47e0.m_data + lVar38 + 0x44)[1] = dVar53 * dStack_34b8 + dVar5 * dStack_3428;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_34b0 +
             pdVar36[local_47a8 + lVar39 + 0x10] * local_3420;
        (local_47e0.m_data + lVar38 + 0x46)[1] = dVar53 * dStack_34a8 + dVar5 * dStack_3418;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (((lVar39 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar39 < (long)puVar1 || (lVar39 < local_47b8)) ||
             (local_47e0.m_rows <= lVar40)))) || (local_47e0.m_cols < 0x5a)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_35c0 +
             pdVar36[(long)local_4778 + lVar39] * local_34a0;
        (local_47e0.m_data + lVar38 + 0x48)[1] = dVar53 * dStack_35b8 + dVar5 * dStack_3498;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_35b0 +
             pdVar36[(long)local_4778 + lVar39 + 2] * local_3490;
        (local_47e0.m_data + lVar38 + 0x4a)[1] = dVar53 * dStack_35a8 + dVar5 * dStack_3488;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_35a0 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_3480;
        (local_47e0.m_data + lVar38 + 0x4c)[1] = dVar53 * dStack_3598 + dVar5 * dStack_3478;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3590 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_3470;
        (local_47e0.m_data + lVar38 + 0x4e)[1] = dVar53 * dStack_3588 + dVar5 * dStack_3468;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_3580 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_3460;
        (local_47e0.m_data + lVar38 + 0x50)[1] = dVar53 * dStack_3578 + dVar5 * dStack_3458;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3570 +
             pdVar36[(long)local_4778 + lVar39 + 10] * local_3450;
        (local_47e0.m_data + lVar38 + 0x52)[1] = dVar53 * dStack_3568 + dVar5 * dStack_3448;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3560 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_3440;
        (local_47e0.m_data + lVar38 + 0x54)[1] = dVar53 * dStack_3558 + dVar5 * dStack_3438;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3550 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_3430;
        (local_47e0.m_data + lVar38 + 0x56)[1] = dVar53 * dStack_3548 + dVar5 * dStack_3428;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3540 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_3420;
        (local_47e0.m_data + lVar38 + 0x58)[1] = dVar53 * dStack_3538 + dVar5 * dStack_3418;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < lVar49)) ||
           ((lVar39 < local_47b8 || ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x6c))))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x5a] =
             pdVar36[local_47a8 + lVar39] * local_35c0 +
             pdVar36[(long)local_4778 + lVar39] * local_3530;
        (local_47e0.m_data + lVar40 + 0x5a)[1] = dVar53 * dStack_35b8 + dVar5 * dStack_3528;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x5c] =
             pdVar36[local_47a8 + lVar39 + 2] * local_35b0 +
             pdVar36[(long)local_4778 + lVar39 + 2] * local_3520;
        (local_47e0.m_data + lVar40 + 0x5c)[1] = dVar53 * dStack_35a8 + dVar5 * dStack_3518;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x5e] =
             pdVar36[local_47a8 + lVar39 + 4] * local_35a0 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_3510;
        (local_47e0.m_data + lVar40 + 0x5e)[1] = dVar53 * dStack_3598 + dVar5 * dStack_3508;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x60] =
             pdVar36[local_47a8 + lVar39 + 6] * local_3590 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_3500;
        (local_47e0.m_data + lVar40 + 0x60)[1] = dVar53 * dStack_3588 + dVar5 * dStack_34f8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x62] =
             pdVar36[local_47a8 + lVar39 + 8] * local_3580 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_34f0;
        (local_47e0.m_data + lVar40 + 0x62)[1] = dVar53 * dStack_3578 + dVar5 * dStack_34e8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 100] =
             pdVar36[local_47a8 + lVar39 + 10] * local_3570 +
             pdVar36[(long)local_4778 + lVar39 + 10] * (double)local_34e0;
        (local_47e0.m_data + lVar40 + 100)[1] = dVar53 * dStack_3568 + dVar5 * dStack_34d8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x66] =
             pdVar36[local_47a8 + lVar39 + 0xc] * local_3560 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_34d0;
        (local_47e0.m_data + lVar40 + 0x66)[1] = dVar53 * dStack_3558 + dVar5 * (double)pdStack_34c8
        ;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x68] =
             pdVar36[local_47a8 + lVar39 + 0xe] * local_3550 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_34c0;
        (local_47e0.m_data + lVar40 + 0x68)[1] = dVar53 * dStack_3548 + dVar5 * dStack_34b8;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x6a] =
             pdVar36[local_47a8 + lVar39 + 0x10] * local_3540 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_34b0;
        (local_47e0.m_data + lVar40 + 0x6a)[1] = dVar53 * dStack_3538 + dVar5 * dStack_34a8;
        if (((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_rows <= lVar34) ||
           (((lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < local_47b8 ||
             (lVar40 = lVar50 + 2, local_47e0.m_rows <= lVar40)) || (local_47e0.m_cols < 0x12))))
        goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39)))[1];
        local_47e0.m_data[lVar38] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39)) * local_3410;
        (local_47e0.m_data + lVar38)[1] = dVar53 * dStack_3408;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)))[1];
        local_47e0.m_data[lVar38 + 2] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 2)) * local_3400;
        (local_47e0.m_data + lVar38 + 2)[1] = dVar53 * dStack_33f8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)))[1];
        local_47e0.m_data[lVar38 + 4] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 4)) * local_33f0;
        (local_47e0.m_data + lVar38 + 4)[1] = dVar53 * dStack_33e8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)))[1];
        local_47e0.m_data[lVar38 + 6] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 6)) * local_33e0;
        (local_47e0.m_data + lVar38 + 6)[1] = dVar53 * dStack_33d8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)))[1];
        local_47e0.m_data[lVar38 + 8] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 8)) * local_33d0;
        (local_47e0.m_data + lVar38 + 8)[1] = dVar53 * dStack_33c8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)))[1];
        local_47e0.m_data[lVar38 + 10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 10)) * local_33c0;
        (local_47e0.m_data + lVar38 + 10)[1] = dVar53 * dStack_33b8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)))[1];
        local_47e0.m_data[lVar38 + 0xc] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xc)) * local_33b0;
        (local_47e0.m_data + lVar38 + 0xc)[1] = dVar53 * dStack_33a8;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)))[1];
        local_47e0.m_data[lVar38 + 0xe] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0xe)) * local_33a0;
        (local_47e0.m_data + lVar38 + 0xe)[1] = dVar53 * dStack_3398;
        dVar53 = ((double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)))[1];
        local_47e0.m_data[lVar38 + 0x10] =
             *(double *)((long)pdVar36 + (long)(local_44e0 + lVar39 + 0x10)) * local_3390;
        (local_47e0.m_data + lVar38 + 0x10)[1] = dVar53 * dStack_3388;
        if ((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar34) ||
            (lVar39 = (local_47c0->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_cols, lVar39 < lVar49)) ||
           ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x24)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x12] = pdVar36[local_47a8 + lVar39] * local_3380;
        (local_47e0.m_data + lVar38 + 0x12)[1] = dVar53 * dStack_3378;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x14] = pdVar36[local_47a8 + lVar39 + 2] * local_3370;
        (local_47e0.m_data + lVar38 + 0x14)[1] = dVar53 * dStack_3368;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x16] = pdVar36[local_47a8 + lVar39 + 4] * local_3360;
        (local_47e0.m_data + lVar38 + 0x16)[1] = dVar53 * dStack_3358;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x18] = pdVar36[local_47a8 + lVar39 + 6] * local_3350;
        (local_47e0.m_data + lVar38 + 0x18)[1] = dVar53 * dStack_3348;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x1a] = pdVar36[local_47a8 + lVar39 + 8] * local_3340;
        (local_47e0.m_data + lVar38 + 0x1a)[1] = dVar53 * dStack_3338;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x1c] = pdVar36[local_47a8 + lVar39 + 10] * local_3330;
        (local_47e0.m_data + lVar38 + 0x1c)[1] = dVar53 * dStack_3328;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x1e] = pdVar36[local_47a8 + lVar39 + 0xc] * local_3320;
        (local_47e0.m_data + lVar38 + 0x1e)[1] = dVar53 * dStack_3318;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x20] = pdVar36[local_47a8 + lVar39 + 0xe] * local_3310;
        (local_47e0.m_data + lVar38 + 0x20)[1] = dVar53 * dStack_3308;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x22] = pdVar36[local_47a8 + lVar39 + 0x10] * local_3300;
        (local_47e0.m_data + lVar38 + 0x22)[1] = dVar53 * dStack_32f8;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < (long)puVar1)) || (local_47e0.m_rows <= lVar40)) ||
           (local_47e0.m_cols < 0x36)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x24] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_32f0;
        (local_47e0.m_data + lVar38 + 0x24)[1] = dVar53 * dStack_32e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x26] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_32e0;
        (local_47e0.m_data + lVar38 + 0x26)[1] = dVar53 * dStack_32d8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x28] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_32d0;
        (local_47e0.m_data + lVar38 + 0x28)[1] = dVar53 * dStack_32c8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x2a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_32c0;
        (local_47e0.m_data + lVar38 + 0x2a)[1] = dVar53 * dStack_32b8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x2c] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_32b0;
        (local_47e0.m_data + lVar38 + 0x2c)[1] = dVar53 * dStack_32a8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x2e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_32a0;
        (local_47e0.m_data + lVar38 + 0x2e)[1] = dVar53 * dStack_3298;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x30] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3290;
        (local_47e0.m_data + lVar38 + 0x30)[1] = dVar53 * dStack_3288;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x32] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3280;
        (local_47e0.m_data + lVar38 + 0x32)[1] = dVar53 * dStack_3278;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        local_47e0.m_data[lVar38 + 0x34] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3270;
        (local_47e0.m_data + lVar38 + 0x34)[1] = dVar53 * dStack_3268;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < (long)puVar1)) || (lVar39 < lVar49)) ||
           ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x48)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x36] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_3380 +
             pdVar36[local_47a8 + lVar39] * local_32f0;
        (local_47e0.m_data + lVar38 + 0x36)[1] = dVar53 * dStack_3378 + dVar5 * dStack_32e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x38] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_3370 +
             pdVar36[local_47a8 + lVar39 + 2] * local_32e0;
        (local_47e0.m_data + lVar38 + 0x38)[1] = dVar53 * dStack_3368 + dVar5 * dStack_32d8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x3a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_3360 +
             pdVar36[local_47a8 + lVar39 + 4] * local_32d0;
        (local_47e0.m_data + lVar38 + 0x3a)[1] = dVar53 * dStack_3358 + dVar5 * dStack_32c8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x3c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_3350 +
             pdVar36[local_47a8 + lVar39 + 6] * local_32c0;
        (local_47e0.m_data + lVar38 + 0x3c)[1] = dVar53 * dStack_3348 + dVar5 * dStack_32b8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x3e] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_3340 +
             pdVar36[local_47a8 + lVar39 + 8] * local_32b0;
        (local_47e0.m_data + lVar38 + 0x3e)[1] = dVar53 * dStack_3338 + dVar5 * dStack_32a8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x40] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_3330 +
             pdVar36[local_47a8 + lVar39 + 10] * local_32a0;
        (local_47e0.m_data + lVar38 + 0x40)[1] = dVar53 * dStack_3328 + dVar5 * dStack_3298;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x42] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_3320 +
             pdVar36[local_47a8 + lVar39 + 0xc] * local_3290;
        (local_47e0.m_data + lVar38 + 0x42)[1] = dVar53 * dStack_3318 + dVar5 * dStack_3288;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x44] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_3310 +
             pdVar36[local_47a8 + lVar39 + 0xe] * local_3280;
        (local_47e0.m_data + lVar38 + 0x44)[1] = dVar53 * dStack_3308 + dVar5 * dStack_3278;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x46] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3300 +
             pdVar36[local_47a8 + lVar39 + 0x10] * local_3270;
        (local_47e0.m_data + lVar38 + 0x46)[1] = dVar53 * dStack_32f8 + dVar5 * dStack_3268;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             ((lVar39 = (local_47c0->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar39 < (long)puVar1 || (lVar39 < local_47b8)))) ||
            (local_47e0.m_rows <= lVar40)) || (local_47e0.m_cols < 0x5a)) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar38 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar38 + 0x48] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                                   super_ChElementBase._vptr_ChElementBase + lVar39)] * local_3410 +
             pdVar36[(long)local_4778 + lVar39] * local_32f0;
        (local_47e0.m_data + lVar38 + 0x48)[1] = dVar53 * dStack_3408 + dVar5 * dStack_32e8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar38 + 0x4a] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 2] * local_3400 +
             pdVar36[(long)local_4778 + lVar39 + 2] * local_32e0;
        (local_47e0.m_data + lVar38 + 0x4a)[1] = dVar53 * dStack_33f8 + dVar5 * dStack_32d8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar38 + 0x4c] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 4] * local_33f0 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_32d0;
        (local_47e0.m_data + lVar38 + 0x4c)[1] = dVar53 * dStack_33e8 + dVar5 * dStack_32c8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                        super_ChElementBase._vptr_ChElementBase + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar38 + 0x4e] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.
                            super_ChElementBase._vptr_ChElementBase + lVar39 + 6] * local_33e0 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_32c0;
        (local_47e0.m_data + lVar38 + 0x4e)[1] = dVar53 * dStack_33d8 + dVar5 * dStack_32b8;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                               super_ChKblock._vptr_ChKblock + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar38 + 0x50] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                                   super_ChKblock._vptr_ChKblock + lVar39)] * local_33d0 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_32b0;
        (local_47e0.m_data + lVar38 + 0x50)[1] = dVar53 * dStack_33c8 + dVar5 * dStack_32a8;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar38 + 0x52] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 2] * local_33c0 +
             pdVar36[(long)local_4778 + lVar39 + 10] * local_32a0;
        (local_47e0.m_data + lVar38 + 0x52)[1] = dVar53 * dStack_33b8 + dVar5 * dStack_3298;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar38 + 0x54] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 4] * local_33b0 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_3290;
        (local_47e0.m_data + lVar38 + 0x54)[1] = dVar53 * dStack_33a8 + dVar5 * dStack_3288;
        dVar53 = (pdVar36 +
                 (long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                        super_ChKblock._vptr_ChKblock + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar38 + 0x56] =
             pdVar36[(long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.
                            super_ChKblock._vptr_ChKblock + lVar39 + 6] * local_33a0 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_3280;
        (local_47e0.m_data + lVar38 + 0x56)[1] = dVar53 * dStack_3398 + dVar5 * dStack_3278;
        dVar53 = (pdVar36 +
                 (long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                               m_storage.m_data + lVar39))[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar38 + 0x58] =
             pdVar36[(long)((long)&(local_47b0->super_ChElementShell).super_ChElementGeneric.Kmatr.K
                                   .super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                   .m_storage.m_data + lVar39)] * local_3390 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_3270;
        (local_47e0.m_data + lVar38 + 0x58)[1] = dVar53 * dStack_3388 + dVar5 * dStack_3268;
        if (((((local_47c0->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar34) ||
             (lVar39 = (local_47c0->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols, lVar39 < lVar49)) || (lVar39 < local_47b8)) ||
           ((local_47e0.m_rows <= lVar40 || (local_47e0.m_cols < 0x6c)))) goto LAB_0076dc55;
        pdVar36 = (local_47c0->m_SD).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        lVar39 = lVar39 * lVar34;
        lVar40 = local_47e0.m_cols * lVar40;
        dVar53 = (pdVar36 + local_47a8 + lVar39)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39)[1];
        local_47e0.m_data[lVar40 + 0x5a] =
             pdVar36[local_47a8 + lVar39] * local_3410 +
             pdVar36[(long)local_4778 + lVar39] * local_3380;
        (local_47e0.m_data + lVar40 + 0x5a)[1] = dVar53 * dStack_3408 + dVar5 * dStack_3378;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 2)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 2)[1];
        local_47e0.m_data[lVar40 + 0x5c] =
             pdVar36[local_47a8 + lVar39 + 2] * local_3400 +
             pdVar36[(long)local_4778 + lVar39 + 2] * local_3370;
        (local_47e0.m_data + lVar40 + 0x5c)[1] = dVar53 * dStack_33f8 + dVar5 * dStack_3368;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 4)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 4)[1];
        local_47e0.m_data[lVar40 + 0x5e] =
             pdVar36[local_47a8 + lVar39 + 4] * local_33f0 +
             pdVar36[(long)local_4778 + lVar39 + 4] * local_3360;
        (local_47e0.m_data + lVar40 + 0x5e)[1] = dVar53 * dStack_33e8 + dVar5 * dStack_3358;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 6)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 6)[1];
        local_47e0.m_data[lVar40 + 0x60] =
             pdVar36[local_47a8 + lVar39 + 6] * local_33e0 +
             pdVar36[(long)local_4778 + lVar39 + 6] * local_3350;
        (local_47e0.m_data + lVar40 + 0x60)[1] = dVar53 * dStack_33d8 + dVar5 * dStack_3348;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 8)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 8)[1];
        local_47e0.m_data[lVar40 + 0x62] =
             pdVar36[local_47a8 + lVar39 + 8] * local_33d0 +
             pdVar36[(long)local_4778 + lVar39 + 8] * local_3340;
        (local_47e0.m_data + lVar40 + 0x62)[1] = dVar53 * dStack_33c8 + dVar5 * dStack_3338;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 10)[1];
        local_47e0.m_data[lVar40 + 100] =
             pdVar36[local_47a8 + lVar39 + 10] * local_33c0 +
             pdVar36[(long)local_4778 + lVar39 + 10] * local_3330;
        (local_47e0.m_data + lVar40 + 100)[1] = dVar53 * dStack_33b8 + dVar5 * dStack_3328;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xc)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xc)[1];
        local_47e0.m_data[lVar40 + 0x66] =
             pdVar36[local_47a8 + lVar39 + 0xc] * local_33b0 +
             pdVar36[(long)local_4778 + lVar39 + 0xc] * local_3320;
        (local_47e0.m_data + lVar40 + 0x66)[1] = dVar53 * dStack_33a8 + dVar5 * dStack_3318;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0xe)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0xe)[1];
        local_47e0.m_data[lVar40 + 0x68] =
             pdVar36[local_47a8 + lVar39 + 0xe] * local_33a0 +
             pdVar36[(long)local_4778 + lVar39 + 0xe] * local_3310;
        (local_47e0.m_data + lVar40 + 0x68)[1] = dVar53 * dStack_3398 + dVar5 * dStack_3308;
        dVar53 = (pdVar36 + local_47a8 + lVar39 + 0x10)[1];
        dVar5 = (pdVar36 + (long)local_4778 + lVar39 + 0x10)[1];
        local_47e0.m_data[lVar40 + 0x6a] =
             pdVar36[local_47a8 + lVar39 + 0x10] * local_3390 +
             pdVar36[(long)local_4778 + lVar39 + 0x10] * local_3300;
        (local_47e0.m_data + lVar40 + 0x6a)[1] = dVar53 * dStack_3388 + dVar5 * dStack_32f8;
        lVar34 = lVar34 + 1;
        lVar50 = lVar50 + 3;
        pCVar43 = local_47c0;
      } while (lVar34 != 0x18);
      pLVar4 = (local_47c0->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar49 = (long)pLVar4[local_46b0].m_material.
                     super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      pCVar43 = (ChElementShellANCF_3833 *)
                pLVar4[local_46b0].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (pCVar43 == (ChElementShellANCF_3833 *)0x0) {
        pCVar43 = (ChElementShellANCF_3833 *)local_38e0;
        memcpy(pCVar43,(void *)(lVar49 + 0x20),0x120);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar30 = &(pCVar43->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar30->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar30->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar30 = &(pCVar43->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar30->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar30->super_ChKblock)._vptr_ChKblock + 1;
        }
        local_47b0 = pCVar43;
        memcpy(local_38e0,(void *)(lVar49 + 0x20),0x120);
        pCVar43 = local_47b0;
        if (local_47b0 != (ChElementShellANCF_3833 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_47b0);
        }
      }
      RotateReorderStiffnessMatrix
                (pCVar43,(ChMatrixNM<double,_6,_6> *)local_38e0,
                 (pCVar31->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar37].m_theta);
      local_4770.m_data = (double *)0x0;
      local_4770.m_rows = 0;
      local_4770.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_4770,0x1e60,0x48,0x6c);
      if ((((local_47e0.m_rows < 0x48) || (local_47e0.m_cols < 0x12)) ||
          ((local_47e0.m_cols < 0x24 ||
           (((local_47e0.m_cols < 0x36 || (local_47e0.m_cols < 0x48)) || (local_47e0.m_cols < 0x5a))
           )))) || (local_47e0.m_cols < 0x6c)) {
LAB_0076dc74:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 72, 18>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 72, BlockCols = 18, InnerPanel = false]"
        ;
        goto LAB_0076dc6a;
      }
      local_4740._0_8_ = local_4770.m_data;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x12)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_38e0._0_8_;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_38e0._8_8_;
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_38e0._16_8_;
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_38e0._24_8_;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_38e0._32_8_;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_38e0._40_8_;
      local_2c40.m_value = local_47e0.m_cols;
      local_4600._0_8_ = local_4770.m_data;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if (((local_47e0.m_rows < 0x48) || ((local_47e0.m_cols < 0x12 || (local_47e0.m_cols < 0x24))))
         || ((local_47e0.m_cols < 0x36 ||
             (((local_47e0.m_cols < 0x48 || (local_47e0.m_cols < 0x5a)) ||
              (local_47e0.m_cols < 0x6c)))))) goto LAB_0076dc74;
      local_4740._0_8_ = local_4770.m_data + 0x12;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0x12;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x24)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_38e0._48_8_;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_38e0._56_8_;
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_38e0._64_8_;
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_38e0._72_8_;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_38e0._80_8_;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_3888;
      local_2c40.m_value = local_47e0.m_cols;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      local_4600._0_8_ = local_4740._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if ((((local_47e0.m_rows < 0x48) || ((local_47e0.m_cols < 0x12 || (local_47e0.m_cols < 0x24)))
           ) || (local_47e0.m_cols < 0x36)) ||
         (((local_47e0.m_cols < 0x48 || (local_47e0.m_cols < 0x5a)) || (local_47e0.m_cols < 0x6c))))
      goto LAB_0076dc74;
      local_4740._0_8_ = local_4770.m_data + 0x24;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0x24;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x36)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_3880;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_3878[0];
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_3878[1];
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_3868;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_3860;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_3858;
      local_2c40.m_value = local_47e0.m_cols;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      local_4600._0_8_ = local_4740._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if ((((local_47e0.m_rows < 0x48) || ((local_47e0.m_cols < 0x12 || (local_47e0.m_cols < 0x24)))
           ) || (local_47e0.m_cols < 0x36)) ||
         (((local_47e0.m_cols < 0x48 || (local_47e0.m_cols < 0x5a)) || (local_47e0.m_cols < 0x6c))))
      goto LAB_0076dc74;
      local_4740._0_8_ = local_4770.m_data + 0x36;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0x36;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x48)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_3850;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_3848[0];
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_3848[1];
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_3838;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_3830;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_3828;
      local_2c40.m_value = local_47e0.m_cols;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      local_4600._0_8_ = local_4740._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if (((local_47e0.m_rows < 0x48) || ((local_47e0.m_cols < 0x12 || (local_47e0.m_cols < 0x24))))
         || ((local_47e0.m_cols < 0x36 ||
             (((local_47e0.m_cols < 0x48 || (local_47e0.m_cols < 0x5a)) ||
              (local_47e0.m_cols < 0x6c)))))) goto LAB_0076dc74;
      local_4740._0_8_ = local_4770.m_data + 0x48;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0x48;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x5a)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_3820;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_3818[0];
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_3818[1];
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_3808;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_3800;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_37f8;
      local_2c40.m_value = local_47e0.m_cols;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      local_4600._0_8_ = local_4740._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if ((((local_47e0.m_rows < 0x48) || ((local_47e0.m_cols < 0x12 || (local_47e0.m_cols < 0x24)))
           ) || (local_47e0.m_cols < 0x36)) ||
         (((local_47e0.m_cols < 0x48 || (local_47e0.m_cols < 0x5a)) || (local_47e0.m_cols < 0x6c))))
      goto LAB_0076dc74;
      local_4740._0_8_ = local_4770.m_data + 0x5a;
      local_4730 = &local_4770;
      avStack_4728[0].m_value = 0;
      avStack_4728[1].m_value = 0x5a;
      dStack_4718 = (double)local_4770.m_cols;
      if ((local_4770.m_rows < 0x48) || (local_4770.m_cols < 0x6c)) goto LAB_0076dc74;
      local_2d10 = local_47e0.m_data + 0x12;
      local_2ce0 = local_47e0.m_data + 0x24;
      local_2cb0 = local_47e0.m_data + 0x36;
      local_2c80 = local_47e0.m_data + 0x48;
      local_2d50[0].m_other = (double)local_37f0;
      local_2d40 = local_47e0.m_data;
      local_2c50 = local_47e0.m_data + 0x5a;
      local_2d30.m_value = local_47e0.m_cols;
      local_2d20.m_other = (double)local_37e8[0];
      local_2d00.m_value = local_47e0.m_cols;
      local_2cf0.m_other = (double)local_37e8[1];
      local_2cd0.m_value = local_47e0.m_cols;
      local_2cc0.m_other = (double)local_37d8;
      local_2ca0.m_value = local_47e0.m_cols;
      local_2c90.m_other = (double)local_37d0;
      local_2c70.m_value = local_47e0.m_cols;
      local_2c60.m_other = (double)local_37c8;
      local_2c40.m_value = local_47e0.m_cols;
      local_45f0.m_value = local_4770.m_cols;
      local_4690.m_dst = (DstEvaluatorType *)local_4600;
      local_4690.m_src = (SrcEvaluatorType *)local_2d80;
      local_4690.m_functor = (assign_op<double,_double> *)&local_4570;
      local_4690.m_dstExpr = (DstXprType *)local_4740;
      local_4600._0_8_ = local_4740._0_8_;
      Eigen::internal::dense_assignment_loop<$6a6cce9$>::run(&local_4690);
      if (local_47a0.m_cols != local_4770.m_cols) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_2d80 = (undefined1  [8])&local_47a0;
      TStack_2d78.m_matrix = (non_const_type)&local_4770;
      if (((local_4748->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_47a0.m_rows) ||
         ((local_4748->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != local_4770.m_rows)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (local_4748,(Matrix<double,__1,__1,_1,__1,__1> *)&local_47a0,&TStack_2d78);
      dVar5 = local_4778;
      this = local_47c0;
      local_4740._0_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xa2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x36] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xd8] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6c] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x10e];
      local_4740._8_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[1] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xa3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x37] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xd9] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6d] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x10f];
      local_4730 = (DenseStorage<double,__1,__1,__1,_1> *)
                   (local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[2] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa4] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x38] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xda] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x110]);
      avStack_4728[0].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[3] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xa5] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x39] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xdb] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x6f] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x111]);
      avStack_4728[1].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[4] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xa6] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x3a] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xdc] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x70] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x112]);
      dStack_4718 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[5] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa7] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xdd] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x71] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x113];
      local_4710 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[6] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa8] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xde] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x72] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x114];
      dStack_4708 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[7] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa9] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xdf] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x73] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x115];
      local_4700 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[8] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xaa] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe0] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x74] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x116];
      dStack_46f8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[9] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xab] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xe1] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x75] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x117];
      local_46f0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xac] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x40] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x76] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x118];
      dStack_46e8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xad] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x41] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xe3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x77] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x119];
      local_46e0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xae] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x42] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe4] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x78] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x11a];
      dStack_46d8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xaf] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x43] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xe5] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x79] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11b];
      local_46d0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xb0] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x44] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe6] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x11c];
      dStack_46c8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb1] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x45] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xe7] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11d];
      local_46c0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xb2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x46] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe8] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x11e];
      dStack_46b8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x47] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xe9] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11f];
      dVar53 = pCVar31->m_Alpha;
      local_4690.m_dst =
           (DstEvaluatorType *)
           (local_37c0[0] *
            (local_37c0[2] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x36] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x36] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6c] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6c]) + dVar53 * (double)local_4740._0_8_);
      local_4690.m_src =
           (SrcEvaluatorType *)
           (local_37c0[1] *
            (local_37c0[3] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[1] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[1] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x37] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x37] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6d] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6d]) + dVar53 * (double)local_4740._8_8_);
      local_4690.m_functor =
           (assign_op<double,_double> *)
           (local_37c0[0] *
            (local_37c0[2] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[2] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[2] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x38] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x38] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6e] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6e]) + dVar53 * (double)local_4730);
      local_4690.m_dstExpr =
           (DstXprType *)
           (local_37c0[1] *
            (local_37c0[3] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[3] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[3] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x39] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x39] +
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6f] *
            local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
            m_data.array[0x6f]) + dVar53 * (double)avStack_4728[0].m_value);
      local_4670 = dVar53 * (double)avStack_4728[1].m_value +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[4] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[4] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x70] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x70]);
      dStack_4668 = dVar53 * dStack_4718 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[5] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[5] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x71] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x71]);
      local_4660 = dVar53 * local_4710 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[6] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[6] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x72] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x72]);
      dStack_4658 = dVar53 * dStack_4708 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[7] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[7] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x73] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x73]);
      local_4650 = dVar53 * local_4700 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[8] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[8] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x74] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x74]);
      dStack_4648 = dVar53 * dStack_46f8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[9] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[9] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x75] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x75]);
      local_4640 = dVar53 * local_46f0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[10] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x40] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x40] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x76] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x76]);
      dStack_4638 = dVar53 * dStack_46e8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x41] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x41] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x77] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x77]);
      local_4630 = dVar53 * local_46e0 +
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x42] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x42] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x78] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x78]) * local_37c0[0];
      dStack_4628 = dVar53 * dStack_46d8 +
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x43] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x43] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x79] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x79]) * local_37c0[1];
      local_4620 = dVar53 * local_46d0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x44] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x44] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7a]);
      dStack_4618 = dVar53 * dStack_46c8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x45] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x45] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7b]);
      local_4610 = dVar53 * local_46c0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x46] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x46] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7c]);
      dStack_4608 = dVar53 * dStack_46b8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x47] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x47] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7d]);
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) {
LAB_0076dca2:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 18, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 18, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0076dc6a;
      }
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_4690.m_dst = (DstEvaluatorType *)(pdVar36[lVar42 * 0x12] * (double)local_4690.m_dst);
      local_4690.m_src =
           (SrcEvaluatorType *)((pdVar36 + lVar42 * 0x12)[1] * (double)local_4690.m_src);
      local_4690.m_functor =
           (assign_op<double,_double> *)(pdVar36[lVar42 * 0x12 + 2] * (double)local_4690.m_functor);
      local_4690.m_dstExpr =
           (DstXprType *)((pdVar36 + lVar42 * 0x12 + 2)[1] * (double)local_4690.m_dstExpr);
      local_4670 = pdVar36[lVar42 * 0x12 + 4] * local_4670;
      dStack_4668 = (pdVar36 + lVar42 * 0x12 + 4)[1] * dStack_4668;
      local_4660 = pdVar36[lVar42 * 0x12 + 6] * local_4660;
      dStack_4658 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_4658;
      local_4650 = pdVar36[lVar42 * 0x12 + 8] * local_4650;
      dStack_4648 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_4648;
      local_4640 = pdVar36[lVar42 * 0x12 + 10] * local_4640;
      dStack_4638 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_4638;
      local_4630 = pdVar36[lVar42 * 0x12 + 0xc] * local_4630;
      dStack_4628 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_4628;
      local_4620 = pdVar36[lVar42 * 0x12 + 0xe] * local_4620;
      dStack_4618 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_4618;
      local_4610 = pdVar36[lVar42 * 0x12 + 0x10] * local_4610;
      dStack_4608 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_4608;
      local_4740._0_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x12] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xb4] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x48] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xea] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x120];
      local_4740._8_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x13] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xb5] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x49] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xeb] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7f] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x121];
      local_4730 = (DenseStorage<double,__1,__1,__1,_1> *)
                   (local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x14] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb6] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4a] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xec] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x80] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x122]);
      avStack_4728[0].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x15] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xb7] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x4b] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xed] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x81] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x123]);
      avStack_4728[1].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x16] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xb8] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x4c] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xee] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x82] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x124]);
      dStack_4718 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x17] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb9] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xef] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x83] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x125];
      local_4710 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x18] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xba] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x4e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xf0] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x84] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x126];
      dStack_4708 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x19] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xbb] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf1] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x85] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x127];
      local_4700 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xbc] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x50] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xf2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x86] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x128];
      dStack_46f8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xbd] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x51] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x87] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x129];
      local_46f0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xbe] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x52] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xf4] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x88] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x12a];
      dStack_46e8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xbf] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x53] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf5] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x89] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[299];
      local_46e0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc0] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x54] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xf6] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[300];
      dStack_46d8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xc1] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x55] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf7] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x12d];
      local_46d0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x20] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x56] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xf8] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x12e];
      dStack_46c8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x21] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xc3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x57] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf9] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x12f];
      local_46c0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x22] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc4] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x58] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xfa] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x130];
      dStack_46b8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x23] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xc5] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x59] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xfb] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x131];
      dVar53 = pCVar31->m_Alpha;
      local_4600._0_8_ =
           local_37c0[0] *
           (local_37c0[2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x12] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x12] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x48] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x48] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7e]) + dVar53 * (double)local_4740._0_8_;
      local_4600._8_8_ =
           local_37c0[1] *
           (local_37c0[3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x13] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x13] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x49] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x49] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7f] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x7f]) + dVar53 * (double)local_4740._8_8_;
      local_45f0.m_value =
           (long)(local_37c0[0] *
                  (local_37c0[2] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x14] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x14] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x4a] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x4a] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x80] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x80]) + dVar53 * (double)local_4730);
      adStack_45e8[0] =
           local_37c0[1] *
           (local_37c0[3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x15] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x15] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4b] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4b] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x81] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x81]) + dVar53 * (double)avStack_4728[0].m_value;
      adStack_45e8[1] =
           dVar53 * (double)avStack_4728[1].m_value +
           local_37c0[0] *
           (local_37c0[2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x16] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x16] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4c] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4c] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x82] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x82]);
      adStack_45e8[2] =
           dVar53 * dStack_4718 +
           local_37c0[1] *
           (local_37c0[3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x17] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x17] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4d] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4d] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x83] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x83]);
      adStack_45e8[3] =
           dVar53 * local_4710 +
           local_37c0[0] *
           (local_37c0[2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x18] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x18] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4e] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x84] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x84]);
      dStack_45c8 = dVar53 * dStack_4708 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x19] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x19] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x85] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x85]);
      local_45c0 = dVar53 * local_4700 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x50] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x50] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x86] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x86]);
      dStack_45b8 = dVar53 * dStack_46f8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x51] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x51] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x87] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x87]);
      local_45b0 = dVar53 * local_46f0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x52] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x52] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x88] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x88]);
      dStack_45a8 = dVar53 * dStack_46e8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x53] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x53] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x89] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x89]);
      local_45a0 = dVar53 * local_46e0 +
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x54] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x54] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8a]) * local_37c0[0];
      dStack_4598 = dVar53 * dStack_46d8 +
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x55] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x55] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8b]) * local_37c0[1];
      local_4590 = dVar53 * local_46d0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x20] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x20] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x56] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x56] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8c]);
      dStack_4588 = dVar53 * dStack_46c8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x21] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x21] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x57] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x57] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8d]);
      local_4580 = dVar53 * local_46c0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x22] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x22] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x58] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x58] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8e]);
      dStack_4578 = dVar53 * dStack_46b8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x23] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x23] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x59] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x59] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8f]);
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_4600._0_8_ = (double *)(pdVar36[lVar42 * 0x12] * (double)local_4600._0_8_);
      local_4600._8_8_ = (pdVar36 + lVar42 * 0x12)[1] * (double)local_4600._8_8_;
      local_45f0.m_value = (long)(pdVar36[lVar42 * 0x12 + 2] * (double)local_45f0.m_value);
      adStack_45e8[0] = (pdVar36 + lVar42 * 0x12 + 2)[1] * adStack_45e8[0];
      adStack_45e8[1] = pdVar36[lVar42 * 0x12 + 4] * adStack_45e8[1];
      adStack_45e8[2] = (pdVar36 + lVar42 * 0x12 + 4)[1] * adStack_45e8[2];
      adStack_45e8[3] = pdVar36[lVar42 * 0x12 + 6] * adStack_45e8[3];
      dStack_45c8 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_45c8;
      local_45c0 = pdVar36[lVar42 * 0x12 + 8] * local_45c0;
      dStack_45b8 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_45b8;
      local_45b0 = pdVar36[lVar42 * 0x12 + 10] * local_45b0;
      dStack_45a8 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_45a8;
      local_45a0 = pdVar36[lVar42 * 0x12 + 0xc] * local_45a0;
      dStack_4598 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_4598;
      local_4590 = pdVar36[lVar42 * 0x12 + 0xe] * local_4590;
      dStack_4588 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_4588;
      local_4580 = pdVar36[lVar42 * 0x12 + 0x10] * local_4580;
      dStack_4578 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_4578;
      local_4740._0_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x24] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xc6] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5a] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xfc] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x90] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x132];
      local_4740._8_8_ =
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x25] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[199] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5b] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0xfd] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x91] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x133];
      local_4730 = (DenseStorage<double,__1,__1,__1,_1> *)
                   (local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x26] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[200] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5c] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xfe] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x92] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x134]);
      avStack_4728[0].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x27] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xc9] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x5d] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xff] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x93] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x135]);
      avStack_4728[1].m_value =
           (long)(local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x28] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0xca] +
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x5e] *
                  local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                  m_storage.m_data.array[0x100] +
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x94] *
                 local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[0x136]);
      dStack_4718 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x29] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xcb] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x101] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x95] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x137];
      local_4710 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xcc] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x60] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x102] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x96] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x138];
      dStack_4708 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xcd] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x61] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x103] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x97] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x139];
      local_4700 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xce] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x62] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x104] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x98] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x13a];
      dStack_46f8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xcf] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[99] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x105] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x99] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x13b];
      local_46f0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xd0] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[100] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x106] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x13c];
      dStack_46e8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd1] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x65] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x107] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x13d];
      local_46e0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x30] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xd2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x66] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x108] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x13e];
      dStack_46d8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x31] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x67] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x109] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x13f];
      local_46d0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x32] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xd4] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x68] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x140];
      dStack_46c8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x33] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd5] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x69] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x10b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x141];
      local_46c0 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x34] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xd6] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa0] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x142];
      dStack_46b8 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x35] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd7] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x10d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa1] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x143];
      dVar53 = pCVar31->m_Alpha;
      local_4570 = local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x24] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x24] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x5a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x5a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x90] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x90]) + dVar53 * (double)local_4740._0_8_;
      dStack_4568 = local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x25] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x25] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x91] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x91]) + dVar53 * (double)local_4740._8_8_;
      local_4560[0] =
           local_37c0[0] *
           (local_37c0[2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x26] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x26] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5c] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5c] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x92] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x92]) + dVar53 * (double)local_4730;
      local_4560[1] =
           local_37c0[1] *
           (local_37c0[3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x27] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x27] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5d] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5d] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x93] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x93]) + dVar53 * (double)avStack_4728[0].m_value;
      local_4560[2] =
           dVar53 * (double)avStack_4728[1].m_value +
           local_37c0[0] *
           (local_37c0[2] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x28] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x28] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5e] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x94] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x94]);
      local_4560[3] =
           dVar53 * dStack_4718 +
           local_37c0[1] *
           (local_37c0[3] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x29] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x29] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5f] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5f] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x95] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x95]);
      local_4540 = dVar53 * local_4710 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x60] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x60] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x96] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x96]);
      dStack_4538 = dVar53 * dStack_4708 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x61] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x61] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x97] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x97]);
      local_4530 = dVar53 * local_4700 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x62] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x62] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x98] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x98]);
      dStack_4528 = dVar53 * dStack_46f8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[99] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[99] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x99] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x99]);
      local_4520 = dVar53 * local_46f0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[100] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[100] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9a]);
      dStack_4518 = dVar53 * dStack_46e8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x65] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x65] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9b]);
      local_4510 = dVar53 * local_46e0 +
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x30] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x30] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x66] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x66] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9c]) * local_37c0[0];
      dStack_4508 = dVar53 * dStack_46d8 +
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x31] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x31] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x67] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x67] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9d]) * local_37c0[1];
      local_4500 = dVar53 * local_46d0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x32] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x32] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x68] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x68] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9e]);
      dStack_44f8 = dVar53 * dStack_46c8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x33] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x33] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x69] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x69] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9f]);
      local_44f0 = dVar53 * local_46c0 +
                   local_37c0[0] *
                   (local_37c0[2] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x34] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x34] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa0] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa0]);
      dStack_44e8 = dVar53 * dStack_46b8 +
                    local_37c0[1] *
                    (local_37c0[3] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x35] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x35] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa1] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa1]);
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_4570 = pdVar36[lVar42 * 0x12] * local_4570;
      dStack_4568 = (pdVar36 + lVar42 * 0x12)[1] * dStack_4568;
      local_4560[0] = pdVar36[lVar42 * 0x12 + 2] * local_4560[0];
      local_4560[1] = (pdVar36 + lVar42 * 0x12 + 2)[1] * local_4560[1];
      local_4560[2] = pdVar36[lVar42 * 0x12 + 4] * local_4560[2];
      local_4560[3] = (pdVar36 + lVar42 * 0x12 + 4)[1] * local_4560[3];
      local_4540 = pdVar36[lVar42 * 0x12 + 6] * local_4540;
      dStack_4538 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_4538;
      local_4530 = pdVar36[lVar42 * 0x12 + 8] * local_4530;
      dStack_4528 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_4528;
      local_4520 = pdVar36[lVar42 * 0x12 + 10] * local_4520;
      dStack_4518 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_4518;
      local_4510 = pdVar36[lVar42 * 0x12 + 0xc] * local_4510;
      dStack_4508 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_4508;
      local_4500 = pdVar36[lVar42 * 0x12 + 0xe] * local_4500;
      dStack_44f8 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_44f8;
      local_44f0 = pdVar36[lVar42 * 0x12 + 0x10] * local_44f0;
      dStack_44e8 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_44e8;
      uVar41 = 0xfffffffffffffffe;
      do {
        dVar53 = *(double *)(local_38e0 + uVar41 * 8 + -0x978);
        dVar57 = *(double *)(local_38e0 + uVar41 * 8 + -0x8e8);
        dVar58 = *(double *)(local_38e0 + uVar41 * 8 + -0x7c8);
        dVar59 = *(double *)(local_38e0 + uVar41 * 8 + -0x468);
        dVar61 = *(double *)(local_38e0 + uVar41 * 8 + -0x738);
        dVar6 = *(double *)(local_38e0 + uVar41 * 8 + -0x2b8);
        dVar7 = *(double *)(local_38e0 + uVar41 * 8 + -0x588);
        dVar8 = *(double *)(local_38e0 + uVar41 * 8 + -0x108);
        dVar9 = *(double *)(local_38e0 + uVar41 * 8 + -0x3d8);
        dVar10 = *(double *)(local_38e0 + uVar41 * 8 + -0x228);
        dVar11 = *(double *)(local_38e0 + uVar41 * 8 + -0x618);
        dVar12 = *(double *)(local_38e0 + uVar41 * 8 + -0x78);
        (&local_4730)[uVar41] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_38e0 + uVar41 * 8 + -0x8f0) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x470) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x740) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x2c0) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x590) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x110) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x980) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x3e0) +
              *(double *)(local_38e0 + uVar41 * 8 + -2000) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x230) +
             *(double *)(local_38e0 + uVar41 * 8 + -0x620) *
             *(double *)(local_38e0 + uVar41 * 8 + -0x80));
        avStack_4728[uVar41].m_value =
             (long)(dVar57 * dVar59 + dVar61 * dVar6 + dVar7 * dVar8 + dVar53 * dVar9 +
                    dVar58 * dVar10 + dVar11 * dVar12);
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      dVar53 = pCVar31->m_Alpha;
      local_4390 = dVar53 * (double)local_4740._0_8_ +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x12] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x24] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x48] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x5a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x90];
      dStack_4388 = dVar53 * (double)local_4740._8_8_ +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x13] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x25] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x49] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x91];
      local_4380[0] =
           dVar53 * (double)local_4730 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x14] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x26] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4a] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5c] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x80] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x92];
      local_4380[1] =
           dVar53 * (double)avStack_4728[0].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x15] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x27] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4b] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5d] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x81] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x93];
      local_4380[2] =
           dVar53 * (double)avStack_4728[1].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x16] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x28] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4c] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5e] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x82] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x94];
      local_4380[3] =
           dVar53 * dStack_4718 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x17] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x29] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4d] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5f] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x83] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x95];
      local_4360 = dVar53 * local_4710 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x18] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x4e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x60] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x84] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x96];
      dStack_4358 = dVar53 * dStack_4708 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x19] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x61] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x85] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x97];
      local_4350 = dVar53 * local_4700 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x50] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x62] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x86] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x98];
      dStack_4348 = dVar53 * dStack_46f8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x51] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[99] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x87] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x99];
      local_4340 = dVar53 * local_46f0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x52] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[100] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x88] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9a];
      dStack_4338 = dVar53 * dStack_46e8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x53] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x65] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x89] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9b];
      local_4330 = dVar53 * local_46e0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x30] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x54] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x66] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9c];
      dStack_4328 = dVar53 * dStack_46d8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x31] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x55] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x67] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9d];
      local_4320 = dVar53 * local_46d0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x20] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x32] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x56] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x68] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9e];
      dStack_4318 = dVar53 * dStack_46c8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x21] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x33] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x57] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x69] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9f];
      local_4310 = dVar53 * local_46c0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x22] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x34] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x58] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa0];
      dStack_4308 = dVar53 * dStack_46b8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x23] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x35] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x59] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa1];
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_4390 = pdVar36[lVar42 * 0x12] * local_4390;
      dStack_4388 = (pdVar36 + lVar42 * 0x12)[1] * dStack_4388;
      local_4380[0] = pdVar36[lVar42 * 0x12 + 2] * local_4380[0];
      local_4380[1] = (pdVar36 + lVar42 * 0x12 + 2)[1] * local_4380[1];
      local_4380[2] = pdVar36[lVar42 * 0x12 + 4] * local_4380[2];
      local_4380[3] = (pdVar36 + lVar42 * 0x12 + 4)[1] * local_4380[3];
      local_4360 = pdVar36[lVar42 * 0x12 + 6] * local_4360;
      dStack_4358 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_4358;
      local_4350 = pdVar36[lVar42 * 0x12 + 8] * local_4350;
      dStack_4348 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_4348;
      local_4340 = pdVar36[lVar42 * 0x12 + 10] * local_4340;
      dStack_4338 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_4338;
      local_4330 = pdVar36[lVar42 * 0x12 + 0xc] * local_4330;
      dStack_4328 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_4328;
      local_4320 = pdVar36[lVar42 * 0x12 + 0xe] * local_4320;
      dStack_4318 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_4318;
      local_4310 = pdVar36[lVar42 * 0x12 + 0x10] * local_4310;
      dStack_4308 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_4308;
      uVar41 = 0xfffffffffffffffe;
      do {
        dVar53 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[uVar41 + 3];
        dVar57 = *(double *)(local_38e0 + uVar41 * 8 + -0x8e8);
        dVar58 = *(double *)(local_38e0 + uVar41 * 8 + -0x858);
        dVar59 = *(double *)(local_38e0 + uVar41 * 8 + -0x4f8);
        dVar61 = *(double *)(local_38e0 + uVar41 * 8 + -0x738);
        dVar6 = *(double *)(local_38e0 + uVar41 * 8 + -0x348);
        dVar7 = *(double *)(local_38e0 + uVar41 * 8 + -0x588);
        dVar8 = *(double *)(local_38e0 + uVar41 * 8 + -0x198);
        dVar9 = *(double *)(local_38e0 + uVar41 * 8 + -0x3d8);
        dVar10 = *(double *)(local_38e0 + uVar41 * 8 + -0x228);
        dVar11 = *(double *)(local_38e0 + uVar41 * 8 + -0x6a8);
        dVar12 = *(double *)(local_38e0 + uVar41 * 8 + -0x78);
        (&local_4730)[uVar41] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_38e0 + uVar41 * 8 + -0x8f0) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x500) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x740) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x350) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x590) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x1a0) +
              local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
              m_data.array[uVar41 + 2] * *(double *)(local_38e0 + uVar41 * 8 + -0x3e0) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x860) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x230) +
             *(double *)(local_38e0 + uVar41 * 8 + -0x6b0) *
             *(double *)(local_38e0 + uVar41 * 8 + -0x80));
        avStack_4728[uVar41].m_value =
             (long)(dVar57 * dVar59 + dVar61 * dVar6 + dVar7 * dVar8 + dVar53 * dVar9 +
                    dVar58 * dVar10 + dVar11 * dVar12);
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      dVar53 = pCVar31->m_Alpha;
      local_4420 = dVar53 * (double)local_4740._0_8_ +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x24] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x36] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x5a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x90];
      dStack_4418 = dVar53 * (double)local_4740._8_8_ +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[1] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x25] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x37] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x5b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x91];
      local_4410[0] =
           dVar53 * (double)local_4730 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[2] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x26] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x38] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5c] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x92];
      local_4410[1] =
           dVar53 * (double)avStack_4728[0].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[3] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x27] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x39] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5d] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6f] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x93];
      local_4410[2] =
           dVar53 * (double)avStack_4728[1].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[4] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x28] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x3a] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5e] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x70] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x94];
      local_4410[3] =
           dVar53 * dStack_4718 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[5] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x29] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x3b] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x5f] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x71] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x95];
      local_43f0 = dVar53 * local_4710 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[6] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x60] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x72] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x96];
      dStack_43e8 = dVar53 * dStack_4708 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[7] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x61] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x73] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x97];
      local_43e0 = dVar53 * local_4700 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[8] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x62] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x74] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x98];
      dStack_43d8 = dVar53 * dStack_46f8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[9] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[99] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x75] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x99];
      local_43d0 = dVar53 * local_46f0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x2e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x40] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[100] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x76] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9a];
      dStack_43c8 = dVar53 * dStack_46e8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x2f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x41] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x65] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x77] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9b];
      local_43c0 = dVar53 * local_46e0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x30] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x42] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x66] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x78] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9c];
      dStack_43b8 = dVar53 * dStack_46d8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x31] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x43] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x67] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x79] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9d];
      local_43b0 = dVar53 * local_46d0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x32] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x44] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x68] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x9e];
      dStack_43a8 = dVar53 * dStack_46c8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x33] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x45] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x69] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x9f];
      local_43a0 = dVar53 * local_46c0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x34] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x46] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xa0];
      dStack_4398 = dVar53 * dStack_46b8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x35] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x47] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xa1];
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_4420 = pdVar36[lVar42 * 0x12] * local_4420;
      dStack_4418 = (pdVar36 + lVar42 * 0x12)[1] * dStack_4418;
      local_4410[0] = pdVar36[lVar42 * 0x12 + 2] * local_4410[0];
      local_4410[1] = (pdVar36 + lVar42 * 0x12 + 2)[1] * local_4410[1];
      local_4410[2] = pdVar36[lVar42 * 0x12 + 4] * local_4410[2];
      local_4410[3] = (pdVar36 + lVar42 * 0x12 + 4)[1] * local_4410[3];
      local_43f0 = pdVar36[lVar42 * 0x12 + 6] * local_43f0;
      dStack_43e8 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_43e8;
      local_43e0 = pdVar36[lVar42 * 0x12 + 8] * local_43e0;
      dStack_43d8 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_43d8;
      local_43d0 = pdVar36[lVar42 * 0x12 + 10] * local_43d0;
      dStack_43c8 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_43c8;
      local_43c0 = pdVar36[lVar42 * 0x12 + 0xc] * local_43c0;
      dStack_43b8 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_43b8;
      local_43b0 = pdVar36[lVar42 * 0x12 + 0xe] * local_43b0;
      dStack_43a8 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_43a8;
      local_43a0 = pdVar36[lVar42 * 0x12 + 0x10] * local_43a0;
      dStack_4398 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_4398;
      uVar41 = 0xfffffffffffffffe;
      do {
        dVar53 = local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage
                 .m_data.array[uVar41 + 3];
        dVar57 = *(double *)(local_38e0 + uVar41 * 8 + -0x978);
        dVar58 = *(double *)(local_38e0 + uVar41 * 8 + -0x858);
        dVar59 = *(double *)(local_38e0 + uVar41 * 8 + -0x4f8);
        dVar61 = *(double *)(local_38e0 + uVar41 * 8 + -0x7c8);
        dVar6 = *(double *)(local_38e0 + uVar41 * 8 + -0x348);
        dVar7 = *(double *)(local_38e0 + uVar41 * 8 + -0x618);
        dVar8 = *(double *)(local_38e0 + uVar41 * 8 + -0x198);
        dVar9 = *(double *)(local_38e0 + uVar41 * 8 + -0x468);
        dVar10 = *(double *)(local_38e0 + uVar41 * 8 + -0x2b8);
        dVar11 = *(double *)(local_38e0 + uVar41 * 8 + -0x6a8);
        dVar12 = *(double *)(local_38e0 + uVar41 * 8 + -0x108);
        (&local_4730)[uVar41] =
             (DenseStorage<double,__1,__1,__1,_1> *)
             (*(double *)(local_38e0 + uVar41 * 8 + -0x980) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x500) +
              *(double *)(local_38e0 + uVar41 * 8 + -2000) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x350) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x620) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x1a0) +
              local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
              m_data.array[uVar41 + 2] * *(double *)(local_38e0 + uVar41 * 8 + -0x470) +
              *(double *)(local_38e0 + uVar41 * 8 + -0x860) *
              *(double *)(local_38e0 + uVar41 * 8 + -0x2c0) +
             *(double *)(local_38e0 + uVar41 * 8 + -0x6b0) *
             *(double *)(local_38e0 + uVar41 * 8 + -0x110));
        avStack_4728[uVar41].m_value =
             (long)(dVar57 * dVar59 + dVar61 * dVar6 + dVar7 * dVar8 + dVar53 * dVar9 +
                    dVar58 * dVar10 + dVar11 * dVar12);
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      dVar53 = pCVar31->m_Alpha;
      local_44b0 = dVar53 * (double)local_4740._0_8_ +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x12] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x36] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x48] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x6c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7e];
      dStack_44a8 = dVar53 * (double)local_4740._8_8_ +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[1] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x13] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x37] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x49] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x6d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7f];
      local_44a0[0] =
           dVar53 * (double)local_4730 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[2] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x14] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x38] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4a] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6e] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x80];
      local_44a0[1] =
           dVar53 * (double)avStack_4728[0].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[3] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x15] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x39] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4b] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x6f] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x81];
      local_44a0[2] =
           dVar53 * (double)avStack_4728[1].m_value +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[4] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x16] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x3a] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4c] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x70] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x82];
      local_44a0[3] =
           dVar53 * dStack_4718 +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[5] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x17] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x3b] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x4d] +
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x71] *
           local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.m_storage.
           m_data.array[0x83];
      local_4480 = dVar53 * local_4710 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[6] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x18] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x4e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x72] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x84];
      dStack_4478 = dVar53 * dStack_4708 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[7] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x19] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x4f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x73] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x85];
      local_4470 = dVar53 * local_4700 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[8] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1a] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x3e] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x50] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x74] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x86];
      dStack_4468 = dVar53 * dStack_46f8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[9] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1b] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x3f] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x51] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x75] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x87];
      local_4460 = dVar53 * local_46f0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1c] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x40] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x52] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x76] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x88];
      dStack_4458 = dVar53 * dStack_46e8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xb] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1d] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x41] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x53] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x77] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x89];
      local_4450 = dVar53 * local_46e0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xc] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x1e] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x42] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x54] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x78] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8a];
      dStack_4448 = dVar53 * dStack_46d8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xd] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x1f] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x43] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x55] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x79] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8b];
      local_4440 = dVar53 * local_46d0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0xe] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x20] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x44] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x56] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7a] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8c];
      dStack_4438 = dVar53 * dStack_46c8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0xf] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x21] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x45] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x57] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7b] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8d];
      local_4430 = dVar53 * local_46c0 +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x10] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x22] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x46] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x58] +
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x7c] *
                   local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                   m_storage.m_data.array[0x8e];
      dStack_4428 = dVar53 * dStack_46b8 +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x11] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x23] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x47] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x59] +
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x7d] *
                    local_4300.super_PlainObjectBase<Eigen::Matrix<double,_54,_6,_0,_54,_6>_>.
                    m_storage.m_data.array[0x8f];
      if (((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows < (long)local_4780) ||
         ((pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols < 1)) goto LAB_0076dca2;
      pdVar36 = (pCVar31->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_44b0 = pdVar36[lVar42 * 0x12] * local_44b0;
      dStack_44a8 = (pdVar36 + lVar42 * 0x12)[1] * dStack_44a8;
      local_44a0[0] = pdVar36[lVar42 * 0x12 + 2] * local_44a0[0];
      local_44a0[1] = (pdVar36 + lVar42 * 0x12 + 2)[1] * local_44a0[1];
      local_44a0[2] = pdVar36[lVar42 * 0x12 + 4] * local_44a0[2];
      local_44a0[3] = (pdVar36 + lVar42 * 0x12 + 4)[1] * local_44a0[3];
      local_4480 = pdVar36[lVar42 * 0x12 + 6] * local_4480;
      dStack_4478 = (pdVar36 + lVar42 * 0x12 + 6)[1] * dStack_4478;
      local_4470 = pdVar36[lVar42 * 0x12 + 8] * local_4470;
      dStack_4468 = (pdVar36 + lVar42 * 0x12 + 8)[1] * dStack_4468;
      local_4460 = pdVar36[lVar42 * 0x12 + 10] * local_4460;
      dStack_4458 = (pdVar36 + lVar42 * 0x12 + 10)[1] * dStack_4458;
      local_4450 = pdVar36[lVar42 * 0x12 + 0xc] * local_4450;
      dStack_4448 = (pdVar36 + lVar42 * 0x12 + 0xc)[1] * dStack_4448;
      local_4440 = pdVar36[lVar42 * 0x12 + 0xe] * local_4440;
      dStack_4438 = (pdVar36 + lVar42 * 0x12 + 0xe)[1] * dStack_4438;
      local_4430 = pdVar36[lVar42 * 0x12 + 0x10] * local_4430;
      dStack_4428 = (pdVar36 + lVar42 * 0x12 + 0x10)[1] * dStack_4428;
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = local_4560[uVar41 + 1];
        dVar57 = local_4380[uVar41 + 1];
        dVar58 = local_4410[uVar41 + 1];
        dVar59 = local_44a0[uVar41 + 1];
        local_2e00[uVar41] =
             (double)local_38e0._0_8_ * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_38e0._8_8_ * (double)(&local_45f0)[uVar41].m_value +
             (double)local_38e0._16_8_ * local_4560[uVar41] +
             (double)local_38e0._24_8_ * local_4380[uVar41] +
             (double)local_38e0._32_8_ * local_4410[uVar41] +
             (double)local_38e0._40_8_ * local_44a0[uVar41];
        local_2e00[uVar41 + 1] =
             (double)local_38e0._0_8_ * (double)pDVar13 +
             (double)local_38e0._8_8_ * adStack_45e8[uVar41] + (double)local_38e0._16_8_ * dVar53 +
             (double)local_38e0._24_8_ * dVar57 + (double)local_38e0._32_8_ * dVar58 +
             (double)local_38e0._40_8_ * dVar59;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = local_4560[uVar41 + 1];
        dVar57 = local_4380[uVar41 + 1];
        dVar58 = local_4410[uVar41 + 1];
        dVar59 = local_44a0[uVar41 + 1];
        local_2e90[uVar41] =
             (double)local_38e0._48_8_ * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_38e0._56_8_ * (double)(&local_45f0)[uVar41].m_value +
             (double)local_38e0._64_8_ * local_4560[uVar41] +
             (double)local_38e0._72_8_ * local_4380[uVar41] +
             (double)local_38e0._80_8_ * local_4410[uVar41] +
             (double)local_3888 * local_44a0[uVar41];
        local_2e90[uVar41 + 1] =
             (double)local_38e0._48_8_ * (double)pDVar13 +
             (double)local_38e0._56_8_ * adStack_45e8[uVar41] + (double)local_38e0._64_8_ * dVar53 +
             (double)local_38e0._72_8_ * dVar57 + (double)local_38e0._80_8_ * dVar58 +
             (double)local_3888 * dVar59;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = local_4560[uVar41 + 1];
        dVar57 = local_4380[uVar41 + 1];
        dVar58 = local_4410[uVar41 + 1];
        dVar59 = local_44a0[uVar41 + 1];
        local_2f20[uVar41] =
             (double)local_3880 * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_3878[0] * (double)(&local_45f0)[uVar41].m_value +
             (double)local_3878[1] * local_4560[uVar41] + (double)local_3868 * local_4380[uVar41] +
             (double)local_3860 * local_4410[uVar41] + (double)local_3858 * local_44a0[uVar41];
        local_2f20[uVar41 + 1] =
             (double)local_3880 * (double)pDVar13 + (double)local_3878[0] * adStack_45e8[uVar41] +
             (double)local_3878[1] * dVar53 + (double)local_3868 * dVar57 +
             (double)local_3860 * dVar58 + (double)local_3858 * dVar59;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = adStack_45e8[uVar41];
        dVar57 = local_4560[uVar41 + 1];
        dVar58 = local_4380[uVar41 + 1];
        dVar59 = local_4410[uVar41 + 1];
        dVar61 = local_44a0[uVar41 + 1];
        *(double *)(local_2fb0 + uVar41 * 8) =
             (double)local_3850 * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_3848[0] * (double)(&local_45f0)[uVar41].m_value +
             (double)local_3848[1] * local_4560[uVar41] + (double)local_3838 * local_4380[uVar41] +
             (double)local_3830 * local_4410[uVar41] + (double)local_3828 * local_44a0[uVar41];
        *(double *)(local_2fb0 + uVar41 * 8 + 8) =
             (double)local_3850 * (double)pDVar13 + (double)local_3848[0] * dVar53 +
             (double)local_3848[1] * dVar57 + (double)local_3838 * dVar58 +
             (double)local_3830 * dVar59 + (double)local_3828 * dVar61;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = adStack_45e8[uVar41];
        dVar57 = local_4560[uVar41 + 1];
        dVar58 = local_4380[uVar41 + 1];
        dVar59 = local_4410[uVar41 + 1];
        dVar61 = local_44a0[uVar41 + 1];
        *(double *)(local_3040 + uVar41 * 8) =
             (double)local_3820 * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_3818[0] * (double)(&local_45f0)[uVar41].m_value +
             (double)local_3818[1] * local_4560[uVar41] + (double)local_3808 * local_4380[uVar41] +
             (double)local_3800 * local_4410[uVar41] + (double)local_37f8 * local_44a0[uVar41];
        *(double *)(local_3040 + uVar41 * 8 + 8) =
             (double)local_3820 * (double)pDVar13 + (double)local_3818[0] * dVar53 +
             (double)local_3818[1] * dVar57 + (double)local_3808 * dVar58 +
             (double)local_3800 * dVar59 + (double)local_37f8 * dVar61;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      uVar41 = 0xfffffffffffffffe;
      do {
        pDVar13 = (&local_4690.m_dstExpr)[uVar41];
        dVar53 = adStack_45e8[uVar41];
        dVar57 = local_4560[uVar41 + 1];
        dVar58 = local_4380[uVar41 + 1];
        dVar59 = local_4410[uVar41 + 1];
        dVar61 = local_44a0[uVar41 + 1];
        *(double *)(local_30d0 + uVar41 * 8) =
             (double)local_37f0 * (double)(&local_4690.m_functor)[uVar41] +
             (double)local_37e8[0] * (double)(&local_45f0)[uVar41].m_value +
             (double)local_37e8[1] * local_4560[uVar41] + (double)local_37d8 * local_4380[uVar41] +
             (double)local_37d0 * local_4410[uVar41] + (double)local_37c8 * local_44a0[uVar41];
        *(double *)(local_30d0 + uVar41 * 8 + 8) =
             (double)local_37f0 * (double)pDVar13 + (double)local_37e8[0] * dVar53 +
             (double)local_37e8[1] * dVar57 + (double)local_37d8 * dVar58 +
             (double)local_37d0 * dVar59 + (double)local_37c8 * dVar61;
        uVar41 = uVar41 + 2;
      } while (uVar41 < 0x10);
      lVar42 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      iVar32 = SUB84(dVar48,0) + 0x12;
      local_47b0 = (ChElementShellANCF_3833 *)CONCAT71(local_47b0._1_7_,iVar32 < 0);
      lVar37 = (long)iVar32 + 0x12;
      iVar33 = SUB84(dVar48,0) + 0x24;
      local_47a8 = CONCAT71(local_47a8._1_7_,iVar33 < 0);
      lVar49 = (long)iVar33 + 0x12;
      if (lVar42 < local_47b8) goto LAB_0076dc55;
      pdVar36 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar50 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      bVar2 = iVar32 < 0 || lVar42 < lVar37;
      local_47b0 = (ChElementShellANCF_3833 *)CONCAT71(local_47b0._1_7_,bVar2);
      bVar3 = iVar33 < 0 || lVar42 < lVar49;
      local_47a8 = CONCAT71(local_47a8._1_7_,bVar3);
      local_44e0 = local_2e10;
      dStack_44d8 = dStack_2e08;
      local_44c0 = local_2e00[0];
      dStack_44b8 = local_2e00[1];
      local_44d0 = local_2e00[2];
      dStack_44c8 = local_2e00[3];
      local_3100 = local_2de0;
      dStack_30f8 = dStack_2dd8;
      local_3110 = local_2dd0;
      dStack_3108 = dStack_2dc8;
      local_3120 = local_2dc0;
      dStack_3118 = dStack_2db8;
      local_3130 = local_2db0;
      dStack_3128 = dStack_2da8;
      local_3140 = local_2da0;
      dStack_3138 = dStack_2d98;
      local_3150 = local_2d90;
      dStack_3148 = dStack_2d88;
      local_3160 = local_2ea0;
      dStack_3158 = dStack_2e98;
      local_3170 = local_2e90[0];
      dStack_3168 = local_2e90[1];
      local_3180 = local_2e90[2];
      dStack_3178 = local_2e90[3];
      local_3190 = local_2e70;
      dStack_3188 = dStack_2e68;
      uVar41 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      local_4780 = (PointerType)(~((long)uVar41 >> 0x3f) & uVar41);
      local_3790[3] = (double)(lVar42 * 8);
      pauVar54 = (undefined1 (*) [16])local_2be0;
      pdVar44 = (PointerType)0x0;
      local_31a0 = local_2e60;
      dStack_3198 = dStack_2e58;
      local_31b0 = local_2e50;
      dStack_31a8 = dStack_2e48;
      local_31c0 = local_2e40;
      dStack_31b8 = dStack_2e38;
      local_31d0 = local_2e30;
      dStack_31c8 = dStack_2e28;
      local_31e0 = local_2e20;
      dStack_31d8 = dStack_2e18;
      local_31f0 = local_2f30;
      dStack_31e8 = dStack_2f28;
      local_3200 = local_2f20[0];
      dStack_31f8 = local_2f20[1];
      local_3210 = local_2f20[2];
      dStack_3208 = local_2f20[3];
      local_3220 = local_2f00;
      dStack_3218 = dStack_2ef8;
      local_3230 = local_2ef0;
      dStack_3228 = dStack_2ee8;
      local_3240 = local_2ee0;
      dStack_3238 = dStack_2ed8;
      pdVar45 = pdVar36;
      pdVar51 = pdVar36;
      do {
        if (((local_4780 == pdVar44) || (bVar2)) || (bVar3)) goto LAB_0076dc55;
        auVar14._8_8_ = dStack_2e08;
        auVar14._0_8_ = local_2e10;
        auVar55 = vmulpd_avx512vl(auVar14,*(undefined1 (*) [16])(pdVar45 + local_4750));
        auVar62._0_8_ = local_30e0 * pdVar45[local_46a8];
        auVar62._8_8_ = dStack_30d8 * (pdVar45 + local_46a8)[1];
        auVar55 = vaddpd_avx512vl(auVar55,auVar62);
        auVar56 = vmulpd_avx512vl(local_3050,*(undefined1 (*) [16])(pdVar45 + (long)local_46a0));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x1a] = auVar55;
        auVar63._0_8_ = local_2e00[0] * pdVar45[local_4750 + 2];
        auVar63._8_8_ = local_2e00[1] * (pdVar45 + local_4750 + 2)[1];
        auVar55 = vmulpd_avx512vl(local_30d0,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 2));
        auVar55 = vaddpd_avx512vl(auVar63,auVar55);
        auVar56 = vmulpd_avx512vl(local_3040,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0->m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x19] = auVar55;
        auVar64._0_8_ = local_2e00[2] * pdVar45[local_4750 + 4];
        auVar64._8_8_ = local_2e00[3] * (pdVar45 + local_4750 + 4)[1];
        auVar55 = vmulpd_avx512vl(local_30c0,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 4));
        auVar55 = vaddpd_avx512vl(auVar64,auVar55);
        auVar56 = vmulpd_avx512vl(local_3030,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0->m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x18] = auVar55;
        auVar65._0_8_ = local_2de0 * pdVar45[local_4750 + 6];
        auVar65._8_8_ = dStack_2dd8 * (pdVar45 + local_4750 + 6)[1];
        auVar55 = vmulpd_avx512vl(local_30b0,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 6));
        auVar55 = vaddpd_avx512vl(auVar65,auVar55);
        auVar56 = vmulpd_avx512vl(local_3020,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0->m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x17] = auVar55;
        auVar66._0_8_ = local_2dd0 * pdVar45[local_4750 + 8];
        auVar66._8_8_ = dStack_2dc8 * (pdVar45 + local_4750 + 8)[1];
        auVar55 = vmulpd_avx512vl(local_30a0,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 8));
        auVar55 = vaddpd_avx512vl(auVar66,auVar55);
        auVar56 = vmulpd_avx512vl(local_3010,
                                  *(undefined1 (*) [16])(pdVar45 + (long)(local_46a0 + 1)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x16] = auVar55;
        auVar67._0_8_ = local_2dc0 * pdVar45[local_4750 + 10];
        auVar67._8_8_ = dStack_2db8 * (pdVar45 + local_4750 + 10)[1];
        auVar55 = vmulpd_avx512vl(local_3090,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 10));
        auVar55 = vaddpd_avx512vl(auVar67,auVar55);
        auVar56 = vmulpd_avx512vl(local_3000,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0[1].m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x15] = auVar55;
        auVar68._0_8_ = local_2db0 * pdVar45[local_4750 + 0xc];
        auVar68._8_8_ = dStack_2da8 * (pdVar45 + local_4750 + 0xc)[1];
        auVar55 = vmulpd_avx512vl(local_3080,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 0xc));
        auVar55 = vaddpd_avx512vl(auVar68,auVar55);
        auVar56 = vmulpd_avx512vl(local_2ff0,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0[1].m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x14] = auVar55;
        auVar69._0_8_ = local_2da0 * pdVar45[local_4750 + 0xe];
        auVar69._8_8_ = dStack_2d98 * (pdVar45 + local_4750 + 0xe)[1];
        auVar55 = vmulpd_avx512vl(local_3070,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 0xe));
        auVar55 = vaddpd_avx512vl(auVar69,auVar55);
        auVar56 = vmulpd_avx512vl(local_2fe0,
                                  *(undefined1 (*) [16])
                                   (pdVar45 + (long)((long)&local_46a0[1].m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x13] = auVar55;
        auVar70._0_8_ = local_2d90 * pdVar45[local_4750 + 0x10];
        auVar70._8_8_ = dStack_2d88 * (pdVar45 + local_4750 + 0x10)[1];
        auVar55 = vmulpd_avx512vl(local_3060,*(undefined1 (*) [16])(pdVar45 + local_46a8 + 0x10));
        auVar55 = vaddpd_avx512vl(auVar70,auVar55);
        auVar56 = vmulpd_avx512vl(local_2fd0,
                                  *(undefined1 (*) [16])(pdVar45 + (long)(local_46a0 + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x12] = auVar55;
        if (((lVar50 <= (long)pdVar44) || (lVar42 < local_47b8)) ||
           ((lVar42 < lVar37 || (lVar42 < lVar49)))) goto LAB_0076dc55;
        auVar71._0_8_ = local_30e0 * pdVar51[local_4750];
        auVar71._8_8_ = dStack_30d8 * (pdVar51 + local_4750)[1];
        auVar29._8_8_ = dStack_2e98;
        auVar29._0_8_ = local_2ea0;
        auVar55 = vmulpd_avx512vl(auVar29,*(undefined1 (*) [16])(pdVar51 + local_46a8));
        auVar55 = vaddpd_avx512vl(auVar71,auVar55);
        auVar56 = vmulpd_avx512vl(local_2fc0,*(undefined1 (*) [16])(pdVar51 + (long)local_46a0));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x11] = auVar55;
        auVar72._0_8_ = local_30d0._0_8_ * pdVar51[local_4750 + 2];
        auVar72._8_8_ = local_30d0._8_8_ * (pdVar51 + local_4750 + 2)[1];
        auVar28._8_8_ = local_2e90[1];
        auVar28._0_8_ = local_2e90[0];
        auVar55 = vmulpd_avx512vl(auVar28,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 2));
        auVar55 = vaddpd_avx512vl(auVar72,auVar55);
        auVar56 = vmulpd_avx512vl(local_2fb0,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0->m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0x10] = auVar55;
        auVar73._0_8_ = local_30c0._0_8_ * pdVar51[local_4750 + 4];
        auVar73._8_8_ = local_30c0._8_8_ * (pdVar51 + local_4750 + 4)[1];
        auVar27._8_8_ = local_2e90[3];
        auVar27._0_8_ = local_2e90[2];
        auVar55 = vmulpd_avx512vl(auVar27,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 4));
        auVar55 = vaddpd_avx512vl(auVar73,auVar55);
        auVar56 = vmulpd_avx512vl(local_2fa0,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0->m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0xf] = auVar55;
        auVar74._0_8_ = local_30b0._0_8_ * pdVar51[local_4750 + 6];
        auVar74._8_8_ = local_30b0._8_8_ * (pdVar51 + local_4750 + 6)[1];
        auVar26._8_8_ = dStack_2e68;
        auVar26._0_8_ = local_2e70;
        auVar55 = vmulpd_avx512vl(auVar26,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 6));
        auVar55 = vaddpd_avx512vl(auVar74,auVar55);
        auVar56 = vmulpd_avx512vl(local_2f90,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0->m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0xe] = auVar55;
        auVar75._0_8_ = local_30a0._0_8_ * pdVar51[local_4750 + 8];
        auVar75._8_8_ = local_30a0._8_8_ * (pdVar51 + local_4750 + 8)[1];
        auVar25._8_8_ = dStack_2e58;
        auVar25._0_8_ = local_2e60;
        auVar55 = vmulpd_avx512vl(auVar25,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 8));
        auVar55 = vaddpd_avx512vl(auVar75,auVar55);
        auVar56 = vmulpd_avx512vl(local_2f80,
                                  *(undefined1 (*) [16])(pdVar51 + (long)(local_46a0 + 1)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0xd] = auVar55;
        auVar55 = vmulpd_avx512vl(local_3090,*(undefined1 (*) [16])(pdVar51 + local_4750 + 10));
        auVar24._8_8_ = dStack_2e48;
        auVar24._0_8_ = local_2e50;
        auVar56 = vmulpd_avx512vl(auVar24,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 10));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2f70,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0[1].m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0xc] = auVar55;
        auVar55 = vmulpd_avx512vl(local_3080,*(undefined1 (*) [16])(pdVar51 + local_4750 + 0xc));
        auVar23._8_8_ = dStack_2e38;
        auVar23._0_8_ = local_2e40;
        auVar56 = vmulpd_avx512vl(auVar23,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 0xc));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2f60,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0[1].m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-0xb] = auVar55;
        auVar55 = vmulpd_avx512vl(local_3070,*(undefined1 (*) [16])(pdVar51 + local_4750 + 0xe));
        auVar22._8_8_ = dStack_2e28;
        auVar22._0_8_ = local_2e30;
        auVar56 = vmulpd_avx512vl(auVar22,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 0xe));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2f50,
                                  *(undefined1 (*) [16])
                                   (pdVar51 + (long)((long)&local_46a0[1].m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-10] = auVar55;
        auVar55 = vmulpd_avx512vl(local_3060,*(undefined1 (*) [16])(pdVar51 + local_4750 + 0x10));
        auVar21._8_8_ = dStack_2e18;
        auVar21._0_8_ = local_2e20;
        auVar56 = vmulpd_avx512vl(auVar21,*(undefined1 (*) [16])(pdVar51 + local_46a8 + 0x10));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2f40,
                                  *(undefined1 (*) [16])(pdVar51 + (long)(local_46a0 + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-9] = auVar55;
        if (((lVar50 <= (long)pdVar44) || (lVar42 < local_47b8)) ||
           ((lVar42 < lVar37 || (lVar42 < lVar49)))) goto LAB_0076dc55;
        auVar76._0_8_ = local_3050._0_8_ * pdVar36[local_4750];
        auVar76._8_8_ = local_3050._8_8_ * (pdVar36 + local_4750)[1];
        auVar55 = vmulpd_avx512vl(local_2fc0,*(undefined1 (*) [16])(pdVar36 + local_46a8));
        auVar55 = vaddpd_avx512vl(auVar76,auVar55);
        auVar20._8_8_ = dStack_2f28;
        auVar20._0_8_ = local_2f30;
        auVar56 = vmulpd_avx512vl(auVar20,*(undefined1 (*) [16])(pdVar36 + (long)local_46a0));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-8] = auVar55;
        auVar77._0_8_ = local_3040._0_8_ * pdVar36[local_4750 + 2];
        auVar77._8_8_ = local_3040._8_8_ * (pdVar36 + local_4750 + 2)[1];
        auVar55 = vmulpd_avx512vl(local_2fb0,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 2));
        auVar55 = vaddpd_avx512vl(auVar77,auVar55);
        auVar19._8_8_ = local_2f20[1];
        auVar19._0_8_ = local_2f20[0];
        auVar56 = vmulpd_avx512vl(auVar19,*(undefined1 (*) [16])
                                           (pdVar36 + (long)((long)&local_46a0->m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-7] = auVar55;
        auVar78._0_8_ = local_3030._0_8_ * pdVar36[local_4750 + 4];
        auVar78._8_8_ = local_3030._8_8_ * (pdVar36 + local_4750 + 4)[1];
        auVar55 = vmulpd_avx512vl(local_2fa0,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 4));
        auVar55 = vaddpd_avx512vl(auVar78,auVar55);
        auVar18._8_8_ = local_2f20[3];
        auVar18._0_8_ = local_2f20[2];
        auVar56 = vmulpd_avx512vl(auVar18,*(undefined1 (*) [16])
                                           (pdVar36 + (long)((long)&local_46a0->m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-6] = auVar55;
        auVar79._0_8_ = local_3020._0_8_ * pdVar36[local_4750 + 6];
        auVar79._8_8_ = local_3020._8_8_ * (pdVar36 + local_4750 + 6)[1];
        auVar55 = vmulpd_avx512vl(local_2f90,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 6));
        auVar55 = vaddpd_avx512vl(auVar79,auVar55);
        auVar17._8_8_ = dStack_2ef8;
        auVar17._0_8_ = local_2f00;
        auVar56 = vmulpd_avx512vl(auVar17,*(undefined1 (*) [16])
                                           (pdVar36 + (long)((long)&local_46a0->m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-5] = auVar55;
        auVar80._0_8_ = local_3010._0_8_ * pdVar36[local_4750 + 8];
        auVar80._8_8_ = local_3010._8_8_ * (pdVar36 + local_4750 + 8)[1];
        auVar55 = vmulpd_avx512vl(local_2f80,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 8));
        auVar55 = vaddpd_avx512vl(auVar80,auVar55);
        auVar16._8_8_ = dStack_2ee8;
        auVar16._0_8_ = local_2ef0;
        auVar56 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])(pdVar36 + (long)(local_46a0 + 1)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-4] = auVar55;
        auVar55 = vmulpd_avx512vl(local_3000,*(undefined1 (*) [16])(pdVar36 + local_4750 + 10));
        auVar56 = vmulpd_avx512vl(local_2f70,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 10));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar15._8_8_ = dStack_2ed8;
        auVar15._0_8_ = local_2ee0;
        auVar56 = vmulpd_avx512vl(auVar15,*(undefined1 (*) [16])
                                           (pdVar36 + (long)((long)&local_46a0[1].m_other + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-3] = auVar55;
        auVar55 = vmulpd_avx512vl(local_2ff0,*(undefined1 (*) [16])(pdVar36 + local_4750 + 0xc));
        auVar56 = vmulpd_avx512vl(local_2f60,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 0xc));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2ed0,
                                  *(undefined1 (*) [16])
                                   (pdVar36 + (long)((long)&local_46a0[1].m_other + 4)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-2] = auVar55;
        auVar55 = vmulpd_avx512vl(local_2fe0,*(undefined1 (*) [16])(pdVar36 + local_4750 + 0xe));
        auVar56 = vmulpd_avx512vl(local_2f50,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 0xe));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2ec0,
                                  *(undefined1 (*) [16])
                                   (pdVar36 + (long)((long)&local_46a0[1].m_other + 6)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        pauVar54[-1] = auVar55;
        auVar55 = vmulpd_avx512vl(local_2fd0,*(undefined1 (*) [16])(pdVar36 + local_4750 + 0x10));
        auVar56 = vmulpd_avx512vl(local_2f40,*(undefined1 (*) [16])(pdVar36 + local_46a8 + 0x10));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        auVar56 = vmulpd_avx512vl(local_2eb0,
                                  *(undefined1 (*) [16])(pdVar36 + (long)(local_46a0 + 2)));
        auVar55 = vaddpd_avx512vl(auVar55,auVar56);
        *pauVar54 = auVar55;
        pdVar44 = (PointerType)((long)pdVar44 + 1);
        pdVar45 = pdVar45 + lVar42;
        pauVar54 = pauVar54 + 0x1b;
        pdVar51 = pdVar51 + lVar42;
        pdVar36 = pdVar36 + lVar42;
      } while (pdVar44 != (PointerType)0x18);
      local_46a8 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols;
      if (local_46a8 < (long)local_3790[2]) {
LAB_0076dc8b:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 54, InnerPanel = false]"
        ;
        goto LAB_0076dc6a;
      }
      pdVar36 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      uVar41 = (pCVar31->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      local_44c0 = (double)(~((long)uVar41 >> 0x3f) & uVar41);
      lVar42 = (long)pdVar36 + (long)local_3790[1] + 0x30;
      local_44d0 = (double)(local_46a8 * 8);
      psVar47 = local_2d50;
      dVar48 = 0.0;
      do {
        dVar53 = dVar48;
        if (dVar53 == local_44c0) goto LAB_0076dc8b;
        local_47b8 = (long)dVar53 * 3;
        lVar50 = local_46a8 * (long)dVar53;
        pdVar44 = (local_4748->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar37 = (local_4748->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar49 = (local_4748->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        local_47b0 = (ChElementShellANCF_3833 *)((long)dVar53 * 3 + 1);
        local_47a8 = (long)dVar53 * 3 + 2;
        local_44e0 = pdVar44 + lVar49 * local_47a8;
        local_4780 = pdVar44 + (long)dVar53 * 3;
        psVar46 = psVar47;
        dVar48 = dVar53;
        do {
          local_30f0 = local_30e8;
          dVar57 = local_3250 * pdVar36[(long)dVar5 + lVar50] *
                   *(double *)(local_2d80 + (long)dVar48 * 0x1b0);
          dVar58 = dStack_3248 * (pdVar36 + (long)dVar5 + lVar50)[1] *
                   (double)(&TStack_2d78)[(long)dVar48 * 0x36].m_matrix;
          dVar59 = local_3250 * pdVar36[(long)dVar5 + lVar50 + 2] *
                   (double)avStack_2d68[(long)dVar48 * 0x36 + -1].m_value;
          dVar61 = dStack_3248 * (pdVar36 + (long)dVar5 + lVar50 + 2)[1] *
                   (double)avStack_2d68[(long)dVar48 * 0x36].m_value;
          uVar41 = 0xfffffffffffffffc;
          do {
            pdVar45 = (double *)(lVar42 + 0x10 + uVar41 * 8);
            dVar57 = dVar57 + local_3250 * *pdVar45 * psVar46[uVar41 + 2].m_other;
            dVar58 = dVar58 + dStack_3248 * pdVar45[1] * (psVar46 + uVar41 + 2)[1].m_other;
            pdVar45 = (double *)(lVar42 + 0x20 + uVar41 * 8);
            dVar59 = dVar59 + local_3250 * *pdVar45 * psVar46[uVar41 + 4].m_other;
            dVar61 = dVar61 + dStack_3248 * pdVar45[1] * (psVar46 + uVar41 + 4)[1].m_other;
            uVar41 = uVar41 + 4;
          } while (uVar41 < 0x2c);
          local_4778 = dVar53;
          local_46a0 = psVar47;
          if ((lVar37 <= local_47b8) ||
             (lVar34 = (long)dVar48 * 3,
             (local_4748->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value <= lVar34)) {
LAB_0076dc36:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          dVar57 = dVar57 + dVar59 +
                   local_3250 * pdVar36[(long)dVar5 + lVar50 + 0x34] *
                   local_2be0[(long)dVar48 * 0x36] +
                   dVar58 + dVar61 +
                   dStack_3248 * (pdVar36 + (long)dVar5 + lVar50 + 0x34)[1] *
                   local_2be0[(long)dVar48 * 0x36 + 1];
          pdVar44[lVar49 * local_47b8 + (long)dVar48 * 3] =
               dVar57 + pdVar44[lVar49 * local_47b8 + (long)dVar48 * 3];
          if ((lVar37 <= (long)local_47b0) ||
             (((lVar39 = lVar34 + 1,
               (local_4748->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar39 ||
               (pdVar44[lVar49 * (long)local_47b0 + (long)dVar48 * 3 + 1] =
                     dVar57 + pdVar44[lVar49 * (long)local_47b0 + (long)dVar48 * 3 + 1],
               lVar37 <= local_47a8)) ||
              (lVar40 = lVar34 + 2,
              (local_4748->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value <= lVar40)))) goto LAB_0076dc36;
          local_44e0[(long)dVar48 * 3 + 2] = dVar57 + local_44e0[(long)dVar48 * 3 + 2];
          if (dVar53 != dVar48) {
            if ((((lVar37 <= lVar34) ||
                 ((local_4748->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= local_47b8)) ||
                ((local_4780[lVar34 * lVar49] = dVar57 + local_4780[lVar34 * lVar49],
                 lVar37 <= lVar39 ||
                 (((local_4748->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= (long)local_47b0 ||
                  (local_4780[lVar39 * lVar49 + 1] = dVar57 + local_4780[lVar39 * lVar49 + 1],
                  lVar37 <= lVar40)))))) ||
               ((local_4748->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value <= local_47a8)) goto LAB_0076dc36;
            local_4780[lVar40 * lVar49 + 2] = dVar57 + local_4780[lVar40 * lVar49 + 2];
          }
          dVar48 = (double)((long)dVar48 + 1);
          psVar46 = psVar46 + 0x36;
        } while (dVar48 != 1.18575755001899e-322);
        lVar42 = lVar42 + local_46a8 * 8;
        psVar47 = psVar47 + 0x36;
        dVar48 = (double)((long)dVar53 + 1U);
      } while ((double)((long)dVar53 + 1U) != 1.18575755001899e-322);
      if (local_4770.m_data != (double *)0x0) {
        free((void *)local_4770.m_data[-1]);
      }
      if (local_47e0.m_data != (double *)0x0) {
        free((void *)local_47e0.m_data[-1]);
      }
      if (local_47a0.m_data != (double *)0x0) {
        free((void *)local_47a0.m_data[-1]);
      }
      local_46b0 = local_46b0 + 1;
      local_4694 = local_4694 + 0x36;
      local_4698 = local_4698 + 0x36;
      local_4750 = (ulong)((int)local_4750 + 0x36);
    } while (local_46b0 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}